

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O2

bool __thiscall FScanner::ScanString(FScanner *this,bool tokens)

{
  int *piVar1;
  FString *this_00;
  byte *pbVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  BYTE BVar8;
  BYTE BVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  char *pcVar14;
  byte *pbVar15;
  int iVar16;
  byte *pbVar17;
  byte *pbVar18;
  uint uVar19;
  byte *pbVar20;
  byte *pbVar21;
  byte *pbVar22;
  uint uVar23;
  bool bVar24;
  bool bVar25;
  long lStack_40;
  FString FStack_38;
  
  CheckOpen(this);
  if (this->AlreadyGot == false) {
    pbVar22 = (byte *)this->ScriptPtr;
  }
  else {
    this->AlreadyGot = false;
    if (!tokens) {
      return true;
    }
    if (this->LastGotToken != false) {
      return true;
    }
    pbVar22 = (byte *)this->LastGotPtr;
    this->ScriptPtr = (char *)pbVar22;
    this->Line = this->LastGotLine;
  }
  this->Crossed = false;
  pbVar2 = (byte *)this->ScriptEndPtr;
  if (pbVar22 < pbVar2) {
    this->LastGotPtr = (char *)pbVar22;
    this->LastGotLine = this->Line;
    piVar1 = &this->TokenType;
LAB_0047aaf0:
    pbVar18 = pbVar22 + 2;
    pbVar17 = pbVar22 + 6;
    lVar13 = 0;
    pbVar21 = pbVar18;
LAB_0047ab04:
    pbVar15 = pbVar22;
    if (tokens) goto LAB_0047ab99;
    if ((this->CMode & 1U) == 0) {
      bVar10 = *pbVar22;
      pbVar18 = pbVar22;
      if (0x2e < bVar10) {
        if (0x3c < bVar10) {
          if ((2 < bVar10 - 0x7b) && (bVar10 != 0x3d)) goto LAB_004806a1;
          pbVar20 = pbVar22 + 1;
          goto LAB_0047b3e0;
        }
        if (bVar10 == 0x2f) {
          pbVar18 = pbVar22 + 1;
          bVar10 = pbVar22[1];
          pbVar15 = pbVar18;
          if (0x2f < bVar10) {
            if (bVar10 < 0x3d) goto LAB_0048070e;
            pbVar20 = pbVar18;
            if (2 < bVar10 - 0x7b) goto LAB_0048073b;
            goto LAB_0047b3e0;
          }
          if (bVar10 < 0x23) goto joined_r0x004806ed;
          if (bVar10 == 0x2a) goto LAB_0047ae9d;
          if (bVar10 != 0x2f) goto LAB_004806a1;
        }
        else if (bVar10 != 0x3b) goto LAB_004806a1;
        pbVar18 = pbVar18 + 1;
        do {
          pbVar22 = pbVar18 + 1;
          bVar10 = *pbVar18;
          pbVar18 = pbVar22;
        } while (bVar10 != 10);
        goto LAB_0047b234;
      }
      if (bVar10 < 0x21) {
        if (bVar10 == 10) goto switchD_0047ad09_caseD_a;
        goto LAB_0047ac18;
      }
      if (bVar10 == 0x21) goto LAB_004806a1;
      if (bVar10 < 0x23) {
LAB_0047b62f:
        pbVar18 = (byte *)this->ScriptEndPtr;
        if (pbVar2 != pbVar18) goto LAB_0047b3ac;
        pbVar22 = pbVar22 + 1;
        this->ScriptPtr = (char *)pbVar22;
        this_00 = &this->BigStringBuffer;
        FString::operator=(this_00,(char *)"");
        this->StringLen = 0;
        pcVar14 = this->StringBuffer;
        goto LAB_0047b661;
      }
      if (bVar10 != 0x23) goto LAB_004806a1;
      bVar10 = pbVar22[1];
      if (bVar10 == 0x65) {
        bVar10 = pbVar22[2];
        if (bVar10 != 0x6e) {
          pbVar15 = pbVar22 + 2;
          goto LAB_004806aa;
        }
        bVar10 = pbVar22[3];
        if (bVar10 != 100) {
          pbVar15 = pbVar22 + 3;
          goto LAB_004806aa;
        }
        bVar10 = pbVar22[4];
        lVar13 = 4;
        if (bVar10 != 0x72) {
          pbVar15 = pbVar22 + 4;
          goto LAB_004806aa;
        }
      }
      else {
        lVar13 = 1;
        if (bVar10 != 0x72) {
          pbVar15 = pbVar22 + 1;
          goto LAB_004806aa;
        }
      }
      bVar10 = pbVar22[lVar13 + 1];
      if (bVar10 != 0x65) {
        pbVar15 = pbVar22 + lVar13 + 1;
        goto LAB_004806aa;
      }
      bVar10 = pbVar22[lVar13 + 2];
      if (bVar10 != 0x67) {
        pbVar15 = pbVar22 + lVar13 + 2;
        goto LAB_004806aa;
      }
      bVar10 = pbVar22[lVar13 + 3];
      if (bVar10 != 0x69) {
        pbVar15 = pbVar22 + lVar13 + 3;
        goto LAB_004806aa;
      }
      bVar10 = pbVar22[lVar13 + 4];
      if (bVar10 == 0x6f) {
        bVar10 = pbVar22[lVar13 + 5];
        pbVar15 = pbVar22 + lVar13 + 5;
        if (bVar10 != 0x6e) goto LAB_004806aa;
        goto LAB_0047af51;
      }
      pbVar15 = pbVar22 + lVar13 + 4;
      goto LAB_004806aa;
    }
    bVar10 = pbVar22[lVar13];
    if (0x39 < bVar10) {
      pbVar20 = pbVar22 + lVar13;
      if (bVar10 < 0x5b) {
        if (bVar10 < 0x3d) {
          if (bVar10 == 0x3a) {
            pbVar18 = pbVar22 + lVar13 + 1;
            bVar25 = *pbVar18 == 0x3a;
          }
          else {
            if (bVar10 != 0x3c) goto LAB_0047b3d9;
            pbVar18 = pbVar22 + lVar13 + 1;
            bVar25 = *pbVar18 == 0x3c;
          }
        }
        else if (bVar10 == 0x3d) {
          pbVar18 = pbVar22 + lVar13 + 1;
          bVar25 = *pbVar18 == 0x3d;
        }
        else {
          if (0x3e < bVar10) {
            if (bVar10 < 0x41) goto LAB_0047b3d9;
            goto LAB_00480749;
          }
          pbVar18 = pbVar22 + lVar13 + 1;
          bVar25 = *pbVar18 == 0x3e;
        }
LAB_0047b3c4:
        pbVar20 = pbVar22 + lVar13 + 2;
        if (!bVar25) {
          pbVar20 = pbVar18;
        }
      }
      else {
        if (bVar10 < 0x7b) {
          if (bVar10 == 0x5f || 0x60 < bVar10) goto LAB_00480749;
        }
        else {
          if (bVar10 == 0x7c) {
            pbVar18 = pbVar22 + lVar13 + 1;
            bVar25 = *pbVar18 == 0x7c;
            goto LAB_0047b3c4;
          }
          if (0x7e < bVar10) goto LAB_00480749;
        }
LAB_0047b3d9:
        pbVar20 = pbVar22 + lVar13 + 1;
      }
      goto LAB_0047b3e0;
    }
    if (bVar10 < 0x26) {
      if (0x20 < bVar10) {
        if (bVar10 != 0x21) {
          if (bVar10 < 0x23) {
            pbVar22 = pbVar22 + lVar13;
            goto LAB_0047b62f;
          }
          if (bVar10 == 0x23) {
            bVar10 = pbVar22[lVar13 + 1];
            if (bVar10 == 0x65) {
              if ((pbVar22[lVar13 + 2] != 0x6e) || (pbVar22[lVar13 + 3] != 100)) goto LAB_0047b3d9;
              bVar10 = pbVar22[lVar13 + 4];
              lVar3 = 4;
            }
            else {
              lVar3 = 1;
            }
            if ((((bVar10 == 0x72) && (pbVar22[lVar13 + 1 + lVar3] == 0x65)) &&
                (pbVar22[lVar13 + 2 + lVar3] == 0x67)) &&
               (((pbVar22[lVar13 + 3 + lVar3] == 0x69 && (pbVar22[lVar13 + 4 + lVar3] == 0x6f)) &&
                (pbVar22[lVar13 + 5 + lVar3] == 0x6e)))) {
              pbVar18 = pbVar17 + lVar3;
              do {
                pbVar22 = pbVar18 + 1;
                bVar10 = *pbVar18;
                pbVar18 = pbVar22;
              } while (bVar10 != 10);
              goto LAB_0047b234;
            }
          }
        }
        goto LAB_0047b3d9;
      }
      if (bVar10 != 10) {
        pbVar22 = pbVar22 + lVar13;
        goto LAB_0047ade0;
      }
      pbVar22 = pbVar22 + lVar13 + 1;
      goto LAB_0047b234;
    }
    if (bVar10 < 0x2d) {
      if (bVar10 == 0x26) {
        pbVar18 = pbVar22 + lVar13 + 1;
        bVar25 = *pbVar18 == 0x26;
        goto LAB_0047b3c4;
      }
      if (0x27 < bVar10) goto LAB_0047b3d9;
      pbVar20 = pbVar22 + lVar13;
      goto LAB_00480749;
    }
    if (bVar10 == 0x2d) {
      pbVar20 = pbVar22 + lVar13 + 1;
      *piVar1 = 0x2d;
      if ((pbVar20 < pbVar2) &&
         (((byte)(*pbVar20 - 0x30) < 10 ||
          (((*pbVar20 == 0x2e && (pbVar22 + lVar13 + 2 < pbVar2)) &&
           ('/' < (char)pbVar22[lVar13 + 2])))))) goto LAB_0047ab8b;
      goto LAB_0047b3e0;
    }
    if (bVar10 < 0x2f) {
      pbVar20 = pbVar22 + lVar13 + 1;
      if (9 < (byte)(*pbVar20 - 0x30)) goto LAB_0047b3e0;
      goto LAB_0047b535;
    }
    if (bVar10 != 0x2f) {
      pbVar18 = pbVar22 + lVar13 + 2;
      goto LAB_0047b57b;
    }
    if (pbVar22[lVar13 + 1] == 0x2a) {
      pbVar22 = pbVar22 + lVar13 + 2;
      goto LAB_0047aea1;
    }
    if (pbVar22[lVar13 + 1] != 0x2f) goto LAB_0047b3d9;
    do {
      pbVar22 = pbVar21 + 1;
      bVar10 = *pbVar21;
      pbVar21 = pbVar22;
    } while (bVar10 != 10);
    goto LAB_0047b234;
  }
  tokens = true;
  lVar13 = 0x28;
LAB_0047b2ea:
  bVar25 = false;
  goto LAB_0047b50e;
LAB_0047ab99:
  bVar10 = *pbVar22;
  pbVar20 = pbVar22;
  if (this->StateMode == '\0') {
    switch(bVar10) {
    case 9:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0x20:
      do {
        while( true ) {
          pbVar22 = pbVar22 + 1;
          bVar10 = *pbVar22;
          if (10 < bVar10) break;
          if (bVar10 != 9) goto LAB_0047aaf0;
        }
      } while (bVar10 == 0x20 || bVar10 < 0xe);
      goto LAB_0047aaf0;
    case 10:
      goto switchD_0047ad09_caseD_a;
    default:
      break;
    case 0x21:
      if (pbVar22[1] == 0x3d) {
        *piVar1 = 0x120;
        pbVar20 = pbVar22 + 2;
      }
      else {
        *piVar1 = 0x21;
        pbVar20 = pbVar22 + 1;
      }
      goto LAB_0047b3e0;
    case 0x22:
      pbVar18 = pbVar22;
LAB_0047c987:
      do {
        pbVar17 = pbVar18 + 1;
        pbVar18 = pbVar18 + 1;
        bVar10 = *pbVar17;
        while (bVar10 == 0x5c) {
          while (pbVar17 = pbVar18 + 1, *pbVar17 != 0x22) {
            pbVar18 = pbVar18 + 1;
            if (*pbVar17 != 0x5c) goto LAB_0047c987;
          }
          pbVar17 = pbVar18 + 2;
          pbVar18 = pbVar18 + 2;
          bVar10 = *pbVar17;
        }
      } while (bVar10 != 0x22);
      *piVar1 = 0x102;
      pbVar20 = pbVar18 + 1;
      goto LAB_0047b3e0;
    case 0x23:
      bVar7 = pbVar22[1];
      if (bVar7 < 0x66) {
        if (bVar7 == 0x49) {
LAB_0047b297:
          if ((((((pbVar22[2] & 0xdf) == 0x4e) && ((pbVar22[3] & 0xdf) == 0x43)) &&
               ((pbVar22[4] & 0xdf) == 0x4c)) &&
              (((pbVar22[5] & 0xdf) == 0x55 && ((pbVar22[6] & 0xdf) == 0x44)))) &&
             ((pbVar22[7] & 0xdf) == 0x45)) {
            *piVar1 = 0x177;
            pbVar20 = pbVar22 + 8;
            goto LAB_0047b3e0;
          }
          break;
        }
        if (((bVar7 != 0x65) || (pbVar22[2] != 0x6e)) ||
           ((pbVar22[3] != 100 || (pbVar22[4] != 0x72)))) break;
        lStack_40 = 4;
      }
      else {
        if (bVar7 < 0x6a) {
          if (bVar7 != 0x69) break;
          goto LAB_0047b297;
        }
        if (bVar7 != 0x72) break;
        lStack_40 = 1;
      }
      if ((((pbVar22[lStack_40 + 1] != 0x65) || (pbVar22[lStack_40 + 2] != 0x67)) ||
          (pbVar22[lStack_40 + 3] != 0x69)) ||
         ((pbVar22[lStack_40 + 4] != 0x6f || (pbVar22[lStack_40 + 5] != 0x6e)))) break;
      pbVar18 = pbVar22 + lStack_40 + 6;
      do {
        pbVar22 = pbVar18 + 1;
        bVar10 = *pbVar18;
        pbVar18 = pbVar22;
      } while (bVar10 != 10);
      goto LAB_0047b234;
    case 0x25:
      if (pbVar22[1] == 0x3d) {
        *piVar1 = 0x112;
        pbVar20 = pbVar22 + 2;
      }
      else {
        *piVar1 = 0x25;
        pbVar20 = pbVar22 + 1;
      }
      goto LAB_0047b3e0;
    case 0x26:
      if (pbVar22[1] == 0x26) {
        *piVar1 = 0x11b;
        pbVar20 = pbVar22 + 2;
      }
      else if (pbVar22[1] == 0x3d) {
        *piVar1 = 0x113;
        pbVar20 = pbVar22 + 2;
      }
      else {
        *piVar1 = 0x26;
        pbVar20 = pbVar22 + 1;
      }
      goto LAB_0047b3e0;
    case 0x27:
      bVar7 = pbVar22[1];
      if (bVar7 != 10) {
        while (bVar7 != 10) {
          if (bVar7 == 0x27) {
            *piVar1 = 0x103;
            pbVar20 = pbVar18;
            goto LAB_0047b3e0;
          }
          bVar7 = *pbVar18;
          pbVar18 = pbVar18 + 1;
        }
      }
      break;
    case 0x28:
      *piVar1 = 0x28;
      pbVar20 = pbVar22 + 1;
      goto LAB_0047b3e0;
    case 0x29:
      *piVar1 = 0x29;
      pbVar20 = pbVar22 + 1;
      goto LAB_0047b3e0;
    case 0x2a:
      if (pbVar22[1] == 0x2a) {
        *piVar1 = 0x123;
        pbVar20 = pbVar22 + 2;
      }
      else if (pbVar22[1] == 0x3d) {
        *piVar1 = 0x110;
        pbVar20 = pbVar22 + 2;
      }
      else {
        *piVar1 = 0x2a;
        pbVar20 = pbVar22 + 1;
      }
      goto LAB_0047b3e0;
    case 0x2b:
      if (pbVar22[1] == 0x2b) {
        *piVar1 = 0x119;
        pbVar20 = pbVar22 + 2;
      }
      else if (pbVar22[1] == 0x3d) {
        *piVar1 = 0x10e;
        pbVar20 = pbVar22 + 2;
      }
      else {
        *piVar1 = 0x2b;
        pbVar20 = pbVar22 + 1;
      }
      goto LAB_0047b3e0;
    case 0x2c:
      *piVar1 = 0x2c;
      pbVar20 = pbVar22 + 1;
      goto LAB_0047b3e0;
    case 0x2d:
      bVar10 = pbVar22[1];
      if (bVar10 < 0x3d) {
        if (bVar10 == 0x2d) {
          *piVar1 = 0x11a;
          pbVar20 = pbVar22 + 2;
          goto LAB_0047b3e0;
        }
      }
      else {
        if (bVar10 == 0x3d) {
          *piVar1 = 0x10f;
          pbVar20 = pbVar22 + 2;
          goto LAB_0047b3e0;
        }
        if (bVar10 < 0x3f) {
          *piVar1 = 0x124;
          pbVar20 = pbVar22 + 2;
          goto LAB_0047b3e0;
        }
      }
      *piVar1 = 0x2d;
      pbVar20 = pbVar22 + 1;
      goto LAB_0047b3e0;
    case 0x2e:
      if (pbVar22[1] == 0x2e) {
        if (pbVar22[2] == 0x2e) {
          *piVar1 = 0x10a;
          pbVar20 = pbVar22 + 3;
        }
        else {
          *piVar1 = 0x109;
          pbVar20 = pbVar22 + 2;
        }
      }
      else {
        pbVar18 = pbVar22 + 1;
        if ((byte)(pbVar22[1] - 0x30) < 10) goto LAB_0047bc1c;
        *piVar1 = 0x2e;
        pbVar20 = pbVar18;
      }
      goto LAB_0047b3e0;
    case 0x2f:
      bVar10 = pbVar22[1];
      if (0x2e < bVar10) {
        if (bVar10 != 0x2f) {
          if (bVar10 == 0x3d) {
            *piVar1 = 0x111;
            pbVar20 = pbVar22 + 2;
            goto LAB_0047b3e0;
          }
          goto LAB_0047c9f7;
        }
        do {
          pbVar22 = pbVar18 + 1;
          bVar10 = *pbVar18;
          pbVar18 = pbVar22;
        } while (bVar10 != 10);
        goto LAB_0047b234;
      }
      if (bVar10 != 0x2a) {
LAB_0047c9f7:
        *piVar1 = 0x2f;
        pbVar20 = pbVar22 + 1;
        goto LAB_0047b3e0;
      }
LAB_0047ae9d:
      pbVar22 = pbVar22 + 2;
      goto LAB_0047aea1;
    case 0x30:
      pbVar18 = pbVar22 + 1;
      bVar10 = pbVar22[1];
      pbVar20 = pbVar18;
      if (bVar10 < 0x56) {
        if (bVar10 < 0x45) {
          if (0x2e < bVar10) {
            if (bVar10 != 0x2f && bVar10 < 0x3a) goto LAB_0047b86a;
            goto LAB_0047ecf7;
          }
          if (bVar10 != 0x2e) goto LAB_0047ecf7;
          goto LAB_0047bc1c;
        }
        if (0x4b < bVar10) {
          if (bVar10 != 0x4c) goto LAB_0047bbbc;
          goto LAB_0047ecd9;
        }
        bVar25 = true;
        if (bVar10 != 0x45) goto LAB_0047ecf7;
        goto LAB_0047d2b6;
      }
      if (bVar10 < 0x6c) {
        if (0x58 < bVar10) {
          bVar25 = true;
          if (bVar10 != 0x65) goto LAB_0047ecf7;
          goto LAB_0047d2b6;
        }
        if (bVar10 != 0x58) goto LAB_0047ecf7;
      }
      else {
        if (bVar10 < 0x76) goto LAB_0047dc19;
        if (bVar10 != 0x78) goto LAB_0047ecf7;
      }
      bVar10 = pbVar22[2];
      if (bVar10 < 0x41) {
        if (9 < (byte)(bVar10 - 0x30)) goto LAB_0047ecf7;
      }
      else if (5 < (byte)(bVar10 + 0x9f) && 0x46 < bVar10) goto LAB_0047ecf7;
      pbVar18 = pbVar22 + 3;
      goto LAB_0047ec99;
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      pbVar18 = pbVar22;
      goto LAB_0047b86a;
    case 0x3a:
      if (pbVar22[1] == 0x3a) {
        *piVar1 = 0x108;
        pbVar20 = pbVar22 + 2;
      }
      else {
        *piVar1 = 0x3a;
        pbVar20 = pbVar22 + 1;
      }
      goto LAB_0047b3e0;
    case 0x3b:
      this->StateOptions = false;
      this->TokenType = 0x3b;
      pbVar20 = pbVar22 + 1;
      goto LAB_0047b3e0;
    case 0x3c:
      bVar10 = pbVar22[1];
      if (0x3b < bVar10) {
        if (bVar10 == 0x3c) {
          if (pbVar22[2] == 0x3d) {
            *piVar1 = 0x10d;
            pbVar20 = pbVar22 + 3;
          }
          else {
            *piVar1 = 0x118;
            pbVar20 = pbVar22 + 2;
          }
          goto LAB_0047b3e0;
        }
        if (bVar10 < 0x3e) {
          *piVar1 = 0x11d;
          pbVar20 = pbVar22 + 2;
          goto LAB_0047b3e0;
        }
        if ((bVar10 == 0x3e) && (pbVar22[2] == 0x3d)) {
          *piVar1 = 0x122;
          pbVar20 = pbVar22 + 3;
          goto LAB_0047b3e0;
        }
      }
      *piVar1 = 0x3c;
      pbVar20 = pbVar22 + 1;
      goto LAB_0047b3e0;
    case 0x3d:
      if (pbVar22[1] == 0x3d) {
        *piVar1 = 0x11f;
        pbVar20 = pbVar22 + 2;
      }
      else {
        *piVar1 = 0x3d;
        pbVar20 = pbVar22 + 1;
      }
      goto LAB_0047b3e0;
    case 0x3e:
      bVar10 = pbVar22[1];
      if (0x3c < bVar10) {
        if (bVar10 == 0x3d) {
          *piVar1 = 0x11e;
          pbVar20 = pbVar22 + 2;
          goto LAB_0047b3e0;
        }
        if (bVar10 < 0x3f) {
          bVar10 = pbVar22[2];
          if (0x3c < bVar10) {
            if (bVar10 == 0x3d) {
              *piVar1 = 0x10b;
              pbVar20 = pbVar22 + 3;
              goto LAB_0047b3e0;
            }
            if (bVar10 < 0x3f) {
              if (pbVar22[3] == 0x3d) {
                *piVar1 = 0x10c;
                pbVar20 = pbVar22 + 4;
              }
              else {
                *piVar1 = 0x117;
                pbVar20 = pbVar22 + 3;
              }
              goto LAB_0047b3e0;
            }
          }
          *piVar1 = 0x116;
          pbVar20 = pbVar22 + 2;
          goto LAB_0047b3e0;
        }
      }
      *piVar1 = 0x3e;
      pbVar20 = pbVar22 + 1;
      goto LAB_0047b3e0;
    case 0x3f:
      *piVar1 = 0x3f;
      pbVar20 = pbVar22 + 1;
      goto LAB_0047b3e0;
    case 0x41:
    case 0x61:
      pbVar20 = pbVar22 + 1;
      bVar10 = pbVar22[1];
      if (bVar10 < 0x56) {
        if (0x4b < bVar10) {
          if (bVar10 < 0x52) {
            if (bVar10 != 0x4c) goto switchD_0047bd6e_caseD_6a;
LAB_0047db21:
            bVar10 = pbVar22[2];
            if ((bVar10 & 0xdf) != 0x49) goto LAB_0047e41c;
            bVar10 = pbVar22[3];
            if ((bVar10 & 0xdf) != 0x47) goto LAB_0047efcd;
            bVar10 = pbVar22[4];
            if ((bVar10 & 0xdf) != 0x4e) goto LAB_0047f9b1;
            bVar10 = pbVar22[5];
            if ((bVar10 & 0xdf) == 0x4f) {
              bVar10 = pbVar22[6];
              if ((bVar10 & 0xdf) == 0x46) {
                pbVar20 = pbVar22 + 7;
                bVar10 = pbVar22[7];
                if (bVar10 < 0x5b) {
                  bVar25 = 0x2f < bVar10;
                  bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                }
                else {
                  if (bVar10 < 0x60) {
                    if (bVar10 == 0x5f) goto LAB_0048066e;
                    goto LAB_004800a5;
                  }
                  bVar25 = bVar10 != 0x60;
                  bVar24 = bVar10 < 0x7b;
                }
                if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_004800a5:
                *piVar1 = 0x180;
                goto LAB_0047b3e0;
              }
              goto LAB_0047f9ba;
            }
            goto LAB_0047fa33;
          }
          if (bVar10 == 0x52) goto LAB_0047de63;
          if (bVar10 != 0x55) goto switchD_0047bd6e_caseD_6a;
LAB_0047dbb4:
          bVar10 = pbVar22[2];
          if ((bVar10 & 0xdf) != 0x54) goto LAB_0047e41c;
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) == 0x4f) {
            pbVar20 = pbVar22 + 4;
            bVar10 = pbVar22[4];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047f656;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f656:
            *piVar1 = 0x155;
            goto LAB_0047b3e0;
          }
          goto LAB_0047efcd;
        }
        if (bVar10 < 0x42) goto switchD_0047bd6e_caseD_6a;
        if (bVar10 != 0x42) {
          if (0x43 < bVar10) goto switchD_0047bd6e_caseD_6a;
LAB_0047e3ba:
          bVar10 = pbVar22[2];
          if ((bVar10 & 0xdf) != 0x54) goto LAB_0047e41c;
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x49) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) == 0x4e) {
            pbVar20 = pbVar22 + 6;
            bVar10 = pbVar22[6];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047ff88;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047ff88:
            *piVar1 = 0x125;
            goto LAB_0047b3e0;
          }
          goto LAB_0047fa33;
        }
      }
      else {
        if (0x6c < bVar10) {
          if (bVar10 < 0x73) {
            if (bVar10 != 0x72) goto switchD_0047bd6e_caseD_6a;
LAB_0047de63:
            bVar10 = pbVar22[2];
            if ((bVar10 & 0xdf) != 0x52) goto LAB_0047e41c;
            bVar10 = pbVar22[3];
            if ((bVar10 & 0xdf) != 0x41) goto LAB_0047efcd;
            bVar10 = pbVar22[4];
            if ((bVar10 & 0xdf) == 0x59) {
              pbVar20 = pbVar22 + 5;
              bVar10 = pbVar22[5];
              if (bVar10 < 0x5b) {
                bVar25 = 0x2f < bVar10;
                bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
              }
              else {
                if (bVar10 < 0x60) {
                  if (bVar10 == 0x5f) goto LAB_0048066e;
                  goto LAB_0047faf4;
                }
                bVar25 = bVar10 != 0x60;
                bVar24 = bVar10 < 0x7b;
              }
              if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047faf4:
              *piVar1 = 0x17d;
              goto LAB_0047b3e0;
            }
            goto LAB_0047f9b1;
          }
          if (bVar10 != 0x75) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047dbb4;
        }
        if (0x62 < bVar10) {
          if (bVar10 != 99) {
            if (bVar10 != 0x6c) goto switchD_0047bd6e_caseD_6a;
            goto LAB_0047db21;
          }
          goto LAB_0047e3ba;
        }
        if (bVar10 != 0x62) goto switchD_0047bd6e_caseD_6a;
      }
      bVar10 = pbVar22[2];
      if ((bVar10 & 0xdf) != 0x53) goto LAB_0047e41c;
      bVar10 = pbVar22[3];
      if ((bVar10 & 0xdf) != 0x54) goto LAB_0047efcd;
      bVar10 = pbVar22[4];
      if ((bVar10 & 0xdf) != 0x52) goto LAB_0047f9b1;
      bVar10 = pbVar22[5];
      if ((bVar10 & 0xdf) == 0x41) {
        bVar10 = pbVar22[6];
        if ((bVar10 & 0xdf) == 0x43) {
          bVar10 = pbVar22[7];
          if ((bVar10 & 0xdf) == 0x54) {
            pbVar20 = pbVar22 + 8;
            bVar10 = pbVar22[8];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_00480295;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_00480295:
            *piVar1 = 0x14e;
            goto LAB_0047b3e0;
          }
          goto LAB_0047f9c3;
        }
        goto LAB_0047f9ba;
      }
      goto LAB_0047fa33;
    case 0x42:
    case 0x62:
      pbVar20 = pbVar22 + 1;
      bVar10 = pbVar22[1];
      if (bVar10 < 0x5a) {
        if (0x51 < bVar10) {
          if (bVar10 != 0x52) {
            if (bVar10 != 0x59) goto switchD_0047bd6e_caseD_6a;
LAB_0047cbcb:
            bVar10 = pbVar22[2];
            if ((bVar10 & 0xdf) != 0x54) goto LAB_0047e41c;
            bVar10 = pbVar22[3];
            if ((bVar10 & 0xdf) == 0x45) {
              pbVar20 = pbVar22 + 4;
              bVar10 = pbVar22[4];
              if (bVar10 < 0x5b) {
                bVar25 = 0x2f < bVar10;
                bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
              }
              else {
                if (bVar10 < 0x60) {
                  if (bVar10 == 0x5f) goto LAB_0048066e;
                  goto LAB_0047f37b;
                }
                bVar25 = bVar10 != 0x60;
                bVar24 = bVar10 < 0x7b;
              }
              if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f37b:
              *piVar1 = 0x138;
              goto LAB_0047b3e0;
            }
            goto LAB_0047efcd;
          }
LAB_0047d4e2:
          pbVar20 = pbVar22 + 2;
          bVar10 = pbVar22[2];
          if (bVar10 < 0x4a) {
            if (bVar10 == 0x45) {
LAB_0047e011:
              bVar10 = pbVar22[3];
              if ((bVar10 & 0xdf) != 0x41) goto LAB_0047efcd;
              bVar10 = pbVar22[4];
              if ((bVar10 & 0xdf) == 0x4b) {
                pbVar20 = pbVar22 + 5;
                bVar10 = pbVar22[5];
                if (bVar10 < 0x5b) {
                  bVar25 = 0x2f < bVar10;
                  bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                }
                else {
                  if (bVar10 < 0x60) {
                    if (bVar10 == 0x5f) goto LAB_0048066e;
                    goto LAB_0047fb26;
                  }
                  bVar25 = bVar10 != 0x60;
                  bVar24 = bVar10 < 0x7b;
                }
                if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047fb26:
                *piVar1 = 0x126;
                goto LAB_0047b3e0;
              }
              goto LAB_0047f9b1;
            }
            if (bVar10 != 0x49) goto switchD_0047bd6e_caseD_6a;
          }
          else {
            if (bVar10 < 0x66) {
              if (bVar10 != 0x65) goto switchD_0047bd6e_caseD_6a;
              goto LAB_0047e011;
            }
            if (bVar10 != 0x69) goto switchD_0047bd6e_caseD_6a;
          }
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x47) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x48) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) != 0x54) goto LAB_0047fa33;
          pbVar20 = pbVar22 + 6;
          bVar10 = pbVar22[6];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
LAB_0047fd4b:
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
          }
          else {
            if (0x5f < bVar10) {
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
              goto LAB_0047fd4b;
            }
            if (bVar10 == 0x5f) goto LAB_0048066e;
          }
          bVar25 = this->StateOptions == false;
          iVar11 = 0x18e;
          goto LAB_004802fe;
        }
        if (bVar10 != 0x4f) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (0x71 < bVar10) {
          if (bVar10 != 0x72) {
            if (bVar10 != 0x79) goto switchD_0047bd6e_caseD_6a;
            goto LAB_0047cbcb;
          }
          goto LAB_0047d4e2;
        }
        if (bVar10 != 0x6f) goto switchD_0047bd6e_caseD_6a;
      }
      bVar10 = pbVar22[2];
      if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047e41c;
      bVar10 = pbVar22[3];
      if ((bVar10 & 0xdf) == 0x4c) {
        pbVar20 = pbVar22 + 4;
        bVar10 = pbVar22[4];
        if (bVar10 < 0x5b) {
          bVar25 = 0x2f < bVar10;
          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
        }
        else {
          if (bVar10 < 0x60) {
            if (bVar10 == 0x5f) goto LAB_0048066e;
            goto LAB_0047f0ab;
          }
          bVar25 = bVar10 != 0x60;
          bVar24 = bVar10 < 0x7b;
        }
        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f0ab:
        *piVar1 = 0x133;
        goto LAB_0047b3e0;
      }
      goto LAB_0047efcd;
    case 0x43:
    case 99:
      bVar10 = pbVar22[1];
      if (bVar10 != 0x41) {
        if (bVar10 == 0x48) {
LAB_0047d3b8:
          bVar10 = pbVar22[2];
          if ((bVar10 & 0xdf) != 0x41) goto LAB_0047e41c;
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) == 0x52) {
            pbVar20 = pbVar22 + 4;
            bVar10 = pbVar22[4];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047f2cb;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f2cb:
            *piVar1 = 0x137;
            goto LAB_0047b3e0;
          }
          goto LAB_0047efcd;
        }
        if (bVar10 == 0x4c) {
LAB_0047d421:
          bVar10 = pbVar22[2];
          if ((bVar10 & 0xdf) != 0x41) goto LAB_0047e41c;
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x53) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) == 0x53) {
            pbVar20 = pbVar22 + 5;
            bVar10 = pbVar22[5];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047f722;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f722:
            *piVar1 = 0x146;
            goto LAB_0047b3e0;
          }
          goto LAB_0047f9b1;
        }
        if (bVar10 != 0x4f) {
          if (bVar10 != 0x52) {
            if (bVar10 == 0x61) goto LAB_0047d475;
            if (bVar10 == 0x68) goto LAB_0047d3b8;
            if (bVar10 == 0x6c) goto LAB_0047d421;
            if (bVar10 == 0x6f) goto LAB_0047d3fa;
            if (bVar10 != 0x72) goto LAB_0047cae5;
          }
          bVar10 = pbVar22[2];
          if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047e41c;
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x53) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) == 0x53) {
            pbVar20 = pbVar22 + 5;
            bVar10 = pbVar22[5];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047f703;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f703:
            *piVar1 = 0x167;
            goto LAB_0047b3e0;
          }
          goto LAB_0047f9b1;
        }
LAB_0047d3fa:
        pbVar20 = pbVar22 + 2;
        bVar10 = pbVar22[2];
        if (bVar10 < 0x4f) {
          if (0x4b < bVar10) {
            if (bVar10 == 0x4c) {
LAB_0047ed17:
              bVar10 = pbVar22[3];
              if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047efcd;
              bVar10 = pbVar22[4];
              if ((bVar10 & 0xdf) == 0x52) {
                pbVar20 = pbVar22 + 5;
                bVar10 = pbVar22[5];
                if (bVar10 < 0x5b) {
                  bVar25 = 0x2f < bVar10;
                  bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                }
                else {
                  if (bVar10 < 0x60) {
                    if (bVar10 == 0x5f) goto LAB_0048066e;
                    goto LAB_0047fcc0;
                  }
                  bVar25 = bVar10 != 0x60;
                  bVar24 = bVar10 < 0x7b;
                }
                if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047fcc0:
                *piVar1 = 0x14c;
                goto LAB_0047b3e0;
              }
              goto LAB_0047f9b1;
            }
            if (bVar10 != 0x4e) goto switchD_0047bd6e_caseD_6a;
LAB_0047e782:
            pbVar20 = pbVar22 + 3;
            bVar10 = pbVar22[3];
            if (bVar10 < 0x55) {
              bVar25 = bVar10 == 0x46;
              if (bVar10 < 0x47) {
LAB_0047f105:
                if (!bVar25) goto switchD_0047bd6e_caseD_6a;
                bVar10 = pbVar22[4];
                if ((bVar10 & 0xdf) != 0x49) goto LAB_0047f9b1;
                bVar10 = pbVar22[5];
                if ((bVar10 & 0xdf) == 0x47) {
                  pbVar20 = pbVar22 + 6;
                  bVar10 = pbVar22[6];
                  if (bVar10 < 0x5b) {
                    bVar25 = 0x2f < bVar10;
                    bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                  }
                  else {
                    if (bVar10 < 0x60) {
                      if (bVar10 == 0x5f) goto LAB_0048066e;
                      goto LAB_004802b4;
                    }
                    bVar25 = bVar10 != 0x60;
                    bVar24 = bVar10 < 0x7b;
                  }
                  if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_004802b4:
                  *piVar1 = 0x16c;
                  goto LAB_0047b3e0;
                }
                goto LAB_0047fa33;
              }
              if (bVar10 < 0x53) goto switchD_0047bd6e_caseD_6a;
              if (bVar10 != 0x54) {
LAB_0047f4c2:
                bVar10 = pbVar22[4];
                if ((bVar10 & 0xdf) == 0x54) {
                  pbVar20 = pbVar22 + 5;
                  bVar10 = pbVar22[5];
                  if (bVar10 < 0x5b) {
                    bVar25 = 0x2f < bVar10;
                    bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                  }
                  else {
                    if (bVar10 < 0x60) {
                      if (bVar10 == 0x5f) goto LAB_0048066e;
                      goto LAB_004800ea;
                    }
                    bVar25 = bVar10 != 0x60;
                    bVar24 = bVar10 < 0x7b;
                  }
                  if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_004800ea:
                  *piVar1 = 0x128;
                  goto LAB_0047b3e0;
                }
                goto LAB_0047f9b1;
              }
            }
            else {
              if (bVar10 < 0x73) {
                bVar25 = bVar10 == 0x66;
                goto LAB_0047f105;
              }
              if (bVar10 == 0x73) goto LAB_0047f4c2;
              if (0x74 < bVar10) goto switchD_0047bd6e_caseD_6a;
            }
            bVar10 = pbVar22[4];
            if ((bVar10 & 0xdf) != 0x49) goto LAB_0047f9b1;
            bVar10 = pbVar22[5];
            if ((bVar10 & 0xdf) == 0x4e) {
              bVar10 = pbVar22[6];
              if ((bVar10 & 0xdf) == 0x55) {
                bVar10 = pbVar22[7];
                if ((bVar10 & 0xdf) == 0x45) {
                  pbVar20 = pbVar22 + 8;
                  bVar10 = pbVar22[8];
                  if (bVar10 < 0x5b) {
                    bVar25 = 0x2f < bVar10;
                    bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                  }
                  else {
                    if (bVar10 < 0x60) {
                      if (bVar10 == 0x5f) goto LAB_0048066e;
                      goto LAB_0048050c;
                    }
                    bVar25 = bVar10 != 0x60;
                    bVar24 = bVar10 < 0x7b;
                  }
                  if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0048050c:
                  *piVar1 = 0x129;
                  goto LAB_0047b3e0;
                }
                goto LAB_0047f9c3;
              }
              goto LAB_0047f9ba;
            }
            goto LAB_0047fa33;
          }
          if (bVar10 != 0x45) goto switchD_0047bd6e_caseD_6a;
        }
        else {
          if (0x6b < bVar10) {
            if (bVar10 == 0x6c) goto LAB_0047ed17;
            if (bVar10 != 0x6e) goto switchD_0047bd6e_caseD_6a;
            goto LAB_0047e782;
          }
          if (bVar10 != 0x65) goto switchD_0047bd6e_caseD_6a;
        }
        bVar10 = pbVar22[3];
        if ((bVar10 & 0xdf) != 0x52) goto LAB_0047efcd;
        bVar10 = pbVar22[4];
        if ((bVar10 & 0xdf) != 0x43) goto LAB_0047f9b1;
        bVar10 = pbVar22[5];
        if ((bVar10 & 0xdf) == 0x45) {
          pbVar20 = pbVar22 + 6;
          bVar10 = pbVar22[6];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_0047fdab;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047fdab:
          *piVar1 = 0x16d;
          goto LAB_0047b3e0;
        }
        goto LAB_0047fa33;
      }
LAB_0047d475:
      pbVar20 = pbVar22 + 2;
      bVar10 = pbVar22[2];
      if (bVar10 < 0x54) {
        if (bVar10 == 0x4e) {
LAB_0047df8b:
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x52) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x41) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) != 0x49) goto LAB_0047fa33;
          bVar10 = pbVar22[6];
          if ((bVar10 & 0xdf) != 0x53) goto LAB_0047f9ba;
          bVar10 = pbVar22[7];
          if ((bVar10 & 0xdf) != 0x45) goto LAB_0047f9c3;
          pbVar20 = pbVar22 + 8;
          bVar10 = pbVar22[8];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
LAB_004802e7:
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
          }
          else {
            if (0x5f < bVar10) {
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
              goto LAB_004802e7;
            }
            if (bVar10 == 0x5f) goto LAB_0048066e;
          }
          bVar25 = this->StateOptions == false;
          iVar11 = 0x188;
          goto LAB_004802fe;
        }
        if (bVar10 != 0x53) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (bVar10 < 0x6f) {
          if (bVar10 != 0x6e) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047df8b;
        }
        if (bVar10 != 0x73) goto switchD_0047bd6e_caseD_6a;
      }
      bVar10 = pbVar22[3];
      if ((bVar10 & 0xdf) == 0x45) {
        pbVar20 = pbVar22 + 4;
        bVar10 = pbVar22[4];
        if (bVar10 < 0x5b) {
          bVar25 = 0x2f < bVar10;
          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
        }
        else {
          if (bVar10 < 0x60) {
            if (bVar10 == 0x5f) goto LAB_0048066e;
            goto LAB_0047f624;
          }
          bVar25 = bVar10 != 0x60;
          bVar24 = bVar10 < 0x7b;
        }
        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f624:
        *piVar1 = 0x127;
        goto LAB_0047b3e0;
      }
      goto LAB_0047efcd;
    case 0x44:
    case 100:
      pbVar20 = pbVar22 + 1;
      bVar10 = pbVar22[1];
      if (bVar10 < 0x50) {
        if (bVar10 == 0x45) {
LAB_0047c891:
          pbVar20 = pbVar22 + 2;
          bVar10 = pbVar22[2];
          if (bVar10 < 0x51) {
            if (bVar10 == 0x46) {
LAB_0047d7a7:
              bVar10 = pbVar22[3];
              if ((bVar10 & 0xdf) != 0x41) goto LAB_0047efcd;
              bVar10 = pbVar22[4];
              if ((bVar10 & 0xdf) != 0x55) goto LAB_0047f9b1;
              bVar10 = pbVar22[5];
              if ((bVar10 & 0xdf) == 0x4c) {
                bVar10 = pbVar22[6];
                if ((bVar10 & 0xdf) == 0x54) {
                  pbVar20 = pbVar22 + 7;
                  bVar10 = pbVar22[7];
                  if (bVar10 < 0x5b) {
                    if (bVar10 < 0x41) {
                      if ((byte)(bVar10 - 0x30) < 10) goto LAB_0048066e;
                      goto LAB_0048015b;
                    }
                    if (bVar10 != 0x50) goto LAB_0048066e;
                  }
                  else {
                    if (bVar10 < 0x61) {
                      if (bVar10 == 0x5f) goto LAB_0048066e;
LAB_0048015b:
                      *piVar1 = 0x12a;
                      goto LAB_0047b3e0;
                    }
                    if (bVar10 != 0x70) {
                      if (bVar10 < 0x7b) goto LAB_0048066e;
                      goto LAB_0048015b;
                    }
                  }
                  bVar10 = pbVar22[8];
                  if ((bVar10 & 0xdf) != 0x52) goto LAB_0047febb;
                  bVar10 = pbVar22[9];
                  if ((bVar10 & 0xdf) == 0x4f) {
                    bVar10 = pbVar22[10];
                    if ((bVar10 & 0xdf) != 0x50) {
                      pbVar20 = pbVar22 + 10;
                      goto switchD_0047bd6e_caseD_6a;
                    }
                    bVar10 = pbVar22[0xb];
                    if ((bVar10 & 0xdf) != 0x45) {
                      pbVar20 = pbVar22 + 0xb;
                      goto switchD_0047bd6e_caseD_6a;
                    }
                    bVar10 = pbVar22[0xc];
                    if ((bVar10 & 0xdf) != 0x52) {
                      pbVar20 = pbVar22 + 0xc;
                      goto switchD_0047bd6e_caseD_6a;
                    }
                    bVar10 = pbVar22[0xd];
                    if ((bVar10 & 0xdf) != 0x54) {
                      pbVar20 = pbVar22 + 0xd;
                      goto switchD_0047bd6e_caseD_6a;
                    }
                    bVar10 = pbVar22[0xe];
                    if ((bVar10 & 0xdf) != 0x49) {
                      pbVar20 = pbVar22 + 0xe;
                      goto switchD_0047bd6e_caseD_6a;
                    }
                    bVar10 = pbVar22[0xf];
                    if ((bVar10 & 0xdf) != 0x45) {
                      pbVar20 = pbVar22 + 0xf;
                      goto switchD_0047bd6e_caseD_6a;
                    }
                    bVar10 = pbVar22[0x10];
                    if ((bVar10 & 0xdf) != 0x53) {
                      pbVar20 = pbVar22 + 0x10;
                      goto switchD_0047bd6e_caseD_6a;
                    }
                    pbVar20 = pbVar22 + 0x11;
                    bVar10 = pbVar22[0x11];
                    if (bVar10 < 0x5b) {
                      bVar25 = 0x2f < bVar10;
                      bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                    }
                    else {
                      if (bVar10 < 0x60) {
                        if (bVar10 == 0x5f) goto LAB_0048066e;
                        goto LAB_00480563;
                      }
                      bVar25 = bVar10 != 0x60;
                      bVar24 = bVar10 < 0x7b;
                    }
                    if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_00480563:
                    *piVar1 = 0x157;
                    goto LAB_0047b3e0;
                  }
                  goto LAB_0047feea;
                }
                goto LAB_0047f9ba;
              }
              goto LAB_0047fa33;
            }
            if (bVar10 != 0x50) goto switchD_0047bd6e_caseD_6a;
          }
          else {
            if (bVar10 < 0x67) {
              if (bVar10 != 0x66) goto switchD_0047bd6e_caseD_6a;
              goto LAB_0047d7a7;
            }
            if (bVar10 != 0x70) goto switchD_0047bd6e_caseD_6a;
          }
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x52) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x45) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) == 0x43) {
            bVar10 = pbVar22[6];
            if ((bVar10 & 0xdf) == 0x41) {
              bVar10 = pbVar22[7];
              if ((bVar10 & 0xdf) == 0x54) {
                bVar10 = pbVar22[8];
                if ((bVar10 & 0xdf) != 0x45) {
LAB_0047febb:
                  pbVar20 = pbVar22 + 8;
                  goto switchD_0047bd6e_caseD_6a;
                }
                bVar10 = pbVar22[9];
                if ((bVar10 & 0xdf) != 0x44) {
LAB_0047feea:
                  pbVar20 = pbVar22 + 9;
                  goto switchD_0047bd6e_caseD_6a;
                }
                pbVar20 = pbVar22 + 10;
                bVar10 = pbVar22[10];
                if (bVar10 < 0x5b) {
                  bVar25 = 0x2f < bVar10;
                  bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                }
                else {
                  if (bVar10 < 0x60) {
                    if (bVar10 == 0x5f) goto LAB_0048066e;
                    goto LAB_00480490;
                  }
                  bVar25 = bVar10 != 0x60;
                  bVar24 = bVar10 < 0x7b;
                }
                if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_00480490:
                *piVar1 = 0x186;
                goto LAB_0047b3e0;
              }
              goto LAB_0047f9c3;
            }
            goto LAB_0047f9ba;
          }
          goto LAB_0047fa33;
        }
        if (bVar10 != 0x4f) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (bVar10 < 0x66) {
          if (bVar10 != 0x65) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047c891;
        }
        if (bVar10 != 0x6f) goto switchD_0047bd6e_caseD_6a;
      }
      pbVar20 = pbVar22 + 2;
      bVar10 = pbVar22[2];
      if (bVar10 < 0x5b) {
        if (bVar10 < 0x41) {
          if ((byte)(bVar10 - 0x30) < 10) goto LAB_0048066e;
LAB_0047d78c:
          *piVar1 = 299;
          goto LAB_0047b3e0;
        }
        if (bVar10 < 0x54) goto LAB_0048066e;
        if (bVar10 == 0x54) {
LAB_0047e444:
          pbVar20 = pbVar22 + 3;
          bVar10 = pbVar22[3];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_0047f241;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f241:
          *piVar1 = 0x166;
          goto LAB_0047b3e0;
        }
        if (0x55 < bVar10) goto LAB_0048066e;
      }
      else {
        if (bVar10 < 0x74) {
          if (0x60 < bVar10 || bVar10 == 0x5f) goto LAB_0048066e;
          goto LAB_0047d78c;
        }
        if (bVar10 == 0x74) goto LAB_0047e444;
        if (0x75 < bVar10) {
          if (bVar10 < 0x7b) goto LAB_0048066e;
          goto LAB_0047d78c;
        }
      }
      bVar10 = pbVar22[3];
      if ((bVar10 & 0xdf) != 0x42) goto LAB_0047efcd;
      bVar10 = pbVar22[4];
      if ((bVar10 & 0xdf) != 0x4c) goto LAB_0047f9b1;
      bVar10 = pbVar22[5];
      if ((bVar10 & 0xdf) == 0x45) {
        pbVar20 = pbVar22 + 6;
        bVar10 = pbVar22[6];
        if (bVar10 < 0x5b) {
          bVar25 = 0x2f < bVar10;
          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
        }
        else {
          if (bVar10 < 0x60) {
            if (bVar10 == 0x5f) goto LAB_0048066e;
            goto LAB_00480054;
          }
          bVar25 = bVar10 != 0x60;
          bVar24 = bVar10 < 0x7b;
        }
        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_00480054:
        *piVar1 = 0x136;
        goto LAB_0047b3e0;
      }
      goto LAB_0047fa33;
    case 0x45:
    case 0x65:
      bVar10 = pbVar22[1];
      if (bVar10 == 0x4c) {
LAB_0047d0b6:
        bVar10 = pbVar22[2];
        if ((bVar10 & 0xdf) != 0x53) goto LAB_0047e41c;
        bVar10 = pbVar22[3];
        if ((bVar10 & 0xdf) == 0x45) {
          pbVar20 = pbVar22 + 4;
          bVar10 = pbVar22[4];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_0047f172;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f172:
          *piVar1 = 300;
          goto LAB_0047b3e0;
        }
        goto LAB_0047efcd;
      }
      if (bVar10 == 0x4e) {
LAB_0047d0f8:
        bVar10 = pbVar22[2];
        if ((bVar10 & 0xdf) != 0x55) goto LAB_0047e41c;
        bVar10 = pbVar22[3];
        if ((bVar10 & 0xdf) == 0x4d) {
          pbVar20 = pbVar22 + 4;
          bVar10 = pbVar22[4];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_0047f191;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f191:
          *piVar1 = 0x147;
          goto LAB_0047b3e0;
        }
        goto LAB_0047efcd;
      }
      if (bVar10 == 0x56) {
LAB_0047d13a:
        bVar10 = pbVar22[2];
        if ((bVar10 & 0xdf) != 0x45) goto LAB_0047e41c;
        bVar10 = pbVar22[3];
        if ((bVar10 & 0xdf) != 0x4e) goto LAB_0047efcd;
        bVar10 = pbVar22[4];
        if ((bVar10 & 0xdf) == 0x54) {
          pbVar20 = pbVar22 + 5;
          bVar10 = pbVar22[5];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_0047f595;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f595:
          *piVar1 = 0x15c;
          goto LAB_0047b3e0;
        }
        goto LAB_0047f9b1;
      }
      if (bVar10 != 0x58) {
        if (bVar10 == 0x6c) goto LAB_0047d0b6;
        if (bVar10 == 0x6e) goto LAB_0047d0f8;
        if (bVar10 == 0x76) goto LAB_0047d13a;
        if (bVar10 != 0x78) {
LAB_0047cae5:
          pbVar20 = pbVar22 + 1;
          goto switchD_0047bd6e_caseD_6a;
        }
      }
      pbVar20 = pbVar22 + 2;
      bVar10 = pbVar22[2];
      if (bVar10 < 0x55) {
        if (0x4f < bVar10) {
          if (bVar10 == 0x50) {
LAB_0047ea4e:
            bVar10 = pbVar22[3];
            if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047efcd;
            bVar10 = pbVar22[4];
            if ((bVar10 & 0xdf) != 0x52) goto LAB_0047f9b1;
            bVar10 = pbVar22[5];
            if ((bVar10 & 0xdf) == 0x54) {
              pbVar20 = pbVar22 + 6;
              bVar10 = pbVar22[6];
              if (bVar10 < 0x5b) {
                bVar25 = 0x2f < bVar10;
                bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
              }
              else {
                if (bVar10 < 0x60) {
                  if (bVar10 == 0x5f) goto LAB_0048066e;
                  goto LAB_0047ff24;
                }
                bVar25 = bVar10 != 0x60;
                bVar24 = bVar10 < 0x7b;
              }
              if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047ff24:
              *piVar1 = 0x170;
              goto LAB_0047b3e0;
            }
            goto LAB_0047fa33;
          }
          if (bVar10 != 0x54) goto switchD_0047bd6e_caseD_6a;
LAB_0047e709:
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x45) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x4e) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) == 0x44) {
            pbVar20 = pbVar22 + 6;
            bVar10 = pbVar22[6];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047ff05;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047ff05:
            *piVar1 = 0x162;
            goto LAB_0047b3e0;
          }
          goto LAB_0047fa33;
        }
        if (bVar10 != 0x45) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (0x6f < bVar10) {
          if (bVar10 == 0x70) goto LAB_0047ea4e;
          if (bVar10 != 0x74) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047e709;
        }
        if (bVar10 != 0x65) goto switchD_0047bd6e_caseD_6a;
      }
      bVar10 = pbVar22[3];
      if ((bVar10 & 0xdf) == 0x43) {
        pbVar20 = pbVar22 + 4;
        bVar10 = pbVar22[4];
        if (bVar10 < 0x5b) {
          bVar25 = 0x2f < bVar10;
          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
        }
        else {
          if (bVar10 < 0x60) {
            if (bVar10 == 0x5f) goto LAB_0048066e;
            goto LAB_0047f5b4;
          }
          bVar25 = bVar10 != 0x60;
          bVar24 = bVar10 < 0x7b;
        }
        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f5b4:
        *piVar1 = 0x156;
        goto LAB_0047b3e0;
      }
      goto LAB_0047efcd;
    case 0x46:
    case 0x66:
      pbVar20 = pbVar22 + 1;
      bVar10 = pbVar22[1];
      if (bVar10 < 0x50) {
        if (bVar10 < 0x4a) {
          if (bVar10 != 0x41) {
            if (bVar10 != 0x49) goto switchD_0047bd6e_caseD_6a;
LAB_0047c577:
            bVar10 = pbVar22[2];
            if ((bVar10 & 0xdf) != 0x4e) goto LAB_0047e41c;
            bVar10 = pbVar22[3];
            if ((bVar10 & 0xdf) != 0x41) goto LAB_0047efcd;
            bVar10 = pbVar22[4];
            if ((bVar10 & 0xdf) == 0x4c) {
              pbVar20 = pbVar22 + 5;
              bVar10 = pbVar22[5];
              if (bVar10 < 0x5b) {
                bVar25 = 0x2f < bVar10;
                bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
              }
              else {
                if (bVar10 < 0x60) {
                  if (bVar10 == 0x5f) goto LAB_0048066e;
                  goto LAB_0047f79e;
                }
                bVar25 = bVar10 != 0x60;
                bVar24 = bVar10 < 0x7b;
              }
              if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f79e:
              *piVar1 = 0x160;
              goto LAB_0047b3e0;
            }
            goto LAB_0047f9b1;
          }
LAB_0047d58b:
          pbVar20 = pbVar22 + 2;
          bVar10 = pbVar22[2];
          if (bVar10 < 0x54) {
            if (bVar10 == 0x4c) {
LAB_0047e0d9:
              bVar10 = pbVar22[3];
              if ((bVar10 & 0xdf) != 0x53) goto LAB_0047efcd;
              bVar10 = pbVar22[4];
              if ((bVar10 & 0xdf) == 0x45) {
                pbVar20 = pbVar22 + 5;
                bVar10 = pbVar22[5];
                if (bVar10 < 0x5b) {
                  bVar25 = 0x2f < bVar10;
                  bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                }
                else {
                  if (bVar10 < 0x60) {
                    if (bVar10 == 0x5f) goto LAB_0048066e;
                    goto LAB_0047fb58;
                  }
                  bVar25 = bVar10 != 0x60;
                  bVar24 = bVar10 < 0x7b;
                }
                if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047fb58:
                *piVar1 = 0x151;
                goto LAB_0047b3e0;
              }
              goto LAB_0047f9b1;
            }
            if (bVar10 != 0x53) goto switchD_0047bd6e_caseD_6a;
          }
          else {
            if (bVar10 < 0x6d) {
              if (bVar10 != 0x6c) goto switchD_0047bd6e_caseD_6a;
              goto LAB_0047e0d9;
            }
            if (bVar10 != 0x73) goto switchD_0047bd6e_caseD_6a;
          }
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x54) goto LAB_0047efcd;
          pbVar20 = pbVar22 + 4;
          bVar10 = pbVar22[4];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
LAB_0047f6af:
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
          }
          else {
            if (0x5f < bVar10) {
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
              goto LAB_0047f6af;
            }
            if (bVar10 == 0x5f) goto LAB_0048066e;
          }
          bVar25 = this->StateOptions == false;
          iVar11 = 0x189;
          goto LAB_004802fe;
        }
        if (bVar10 == 0x4c) {
LAB_0047ce3a:
          bVar10 = pbVar22[2];
          if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047e41c;
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x41) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) == 0x54) {
            pbVar20 = pbVar22 + 5;
            bVar10 = pbVar22[5];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047f870;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f870:
            *piVar1 = 0x134;
            goto LAB_0047b3e0;
          }
          goto LAB_0047f9b1;
        }
        if (bVar10 != 0x4f) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (bVar10 < 0x6a) {
          if (bVar10 != 0x61) {
            if (bVar10 != 0x69) goto switchD_0047bd6e_caseD_6a;
            goto LAB_0047c577;
          }
          goto LAB_0047d58b;
        }
        if (bVar10 < 0x6d) {
          if (bVar10 != 0x6c) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047ce3a;
        }
        if (bVar10 != 0x6f) goto switchD_0047bd6e_caseD_6a;
      }
      bVar10 = pbVar22[2];
      if ((bVar10 & 0xdf) != 0x52) goto LAB_0047e41c;
      pbVar20 = pbVar22 + 3;
      bVar10 = pbVar22[3];
      if (bVar10 < 0x5b) {
        if (bVar10 < 0x41) {
          if ((byte)(bVar10 - 0x30) < 10) goto LAB_0048066e;
          goto LAB_0047f44a;
        }
        if (bVar10 != 0x45) goto LAB_0048066e;
      }
      else {
        if (bVar10 < 0x61) {
          if (bVar10 == 0x5f) goto LAB_0048066e;
LAB_0047f44a:
          *piVar1 = 0x12d;
          goto LAB_0047b3e0;
        }
        if (bVar10 != 0x65) {
          if (bVar10 < 0x7b) goto LAB_0048066e;
          goto LAB_0047f44a;
        }
      }
      bVar10 = pbVar22[4];
      if ((bVar10 & 0xdf) != 0x41) goto LAB_0047f9b1;
      bVar10 = pbVar22[5];
      if ((bVar10 & 0xdf) == 0x43) {
        bVar10 = pbVar22[6];
        if ((bVar10 & 0xdf) == 0x48) {
          pbVar20 = pbVar22 + 7;
          bVar10 = pbVar22[7];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_004801cb;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_004801cb:
          *piVar1 = 0x14f;
          goto LAB_0047b3e0;
        }
        goto LAB_0047f9ba;
      }
      goto LAB_0047fa33;
    case 0x47:
    case 0x67:
      pbVar20 = pbVar22 + 1;
      bVar10 = pbVar22[1];
      if (bVar10 < 0x50) {
        if (bVar10 == 0x4c) {
LAB_0047c6c2:
          bVar10 = pbVar22[2];
          if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047e41c;
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x42) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x41) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) == 0x4c) {
            pbVar20 = pbVar22 + 6;
            bVar10 = pbVar22[6];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047f8ae;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f8ae:
            *piVar1 = 0x175;
            goto LAB_0047b3e0;
          }
          goto LAB_0047fa33;
        }
        if (bVar10 != 0x4f) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (bVar10 < 0x6d) {
          if (bVar10 != 0x6c) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047c6c2;
        }
        if (bVar10 != 0x6f) goto switchD_0047bd6e_caseD_6a;
      }
      bVar10 = pbVar22[2];
      if ((bVar10 & 0xdf) != 0x54) goto LAB_0047e41c;
      bVar10 = pbVar22[3];
      if ((bVar10 & 0xdf) == 0x4f) {
        pbVar20 = pbVar22 + 4;
        bVar10 = pbVar22[4];
        if (bVar10 < 0x5b) {
          bVar25 = 0x2f < bVar10;
          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
        }
        else {
          if (bVar10 < 0x60) {
            if (bVar10 == 0x5f) goto LAB_0048066e;
            goto LAB_0047f07f;
          }
          bVar25 = bVar10 != 0x60;
          bVar24 = bVar10 < 0x7b;
        }
        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f07f:
        *piVar1 = 0x14d;
        goto LAB_0047b3e0;
      }
      goto LAB_0047efcd;
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x51:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5f:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x71:
    case 0x78:
    case 0x79:
    case 0x7a:
      goto LAB_0048066e;
    case 0x49:
    case 0x69:
      pbVar20 = pbVar22 + 1;
      bVar10 = pbVar22[1];
      if (bVar10 < 0x54) {
        if (0x4d < bVar10) {
          if (bVar10 == 0x4e) {
LAB_0047d564:
            pbVar20 = pbVar22 + 2;
            bVar10 = pbVar22[2];
            if (bVar10 < 0x5b) {
              if (bVar10 < 0x41) {
                if ((byte)(bVar10 - 0x30) < 10) goto LAB_0048066e;
LAB_0047e0be:
                *piVar1 = 0x17e;
                goto LAB_0047b3e0;
              }
              if (bVar10 < 0x53) goto LAB_0048066e;
              if (bVar10 == 0x53) {
LAB_0047e92c:
                bVar10 = pbVar22[3];
                if ((bVar10 & 0xdf) != 0x54) goto LAB_0047efcd;
                bVar10 = pbVar22[4];
                if ((bVar10 & 0xdf) != 0x41) goto LAB_0047f9b1;
                bVar10 = pbVar22[5];
                if ((bVar10 & 0xdf) == 0x4e) {
                  bVar10 = pbVar22[6];
                  if ((bVar10 & 0xdf) == 0x43) {
                    bVar10 = pbVar22[7];
                    if ((bVar10 & 0xdf) == 0x45) {
                      bVar10 = pbVar22[8];
                      if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047febb;
                      bVar10 = pbVar22[9];
                      if ((bVar10 & 0xdf) == 0x46) {
                        pbVar20 = pbVar22 + 10;
                        bVar10 = pbVar22[10];
                        if (bVar10 < 0x5b) {
                          bVar25 = 0x2f < bVar10;
                          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                        }
                        else {
                          if (bVar10 < 0x60) {
                            if (bVar10 == 0x5f) goto LAB_0048066e;
                            goto LAB_004804ed;
                          }
                          bVar25 = bVar10 != 0x60;
                          bVar24 = bVar10 < 0x7b;
                        }
                        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_004804ed:
                        *piVar1 = 0x154;
                        goto LAB_0047b3e0;
                      }
                      goto LAB_0047feea;
                    }
                    goto LAB_0047f9c3;
                  }
                  goto LAB_0047f9ba;
                }
                goto LAB_0047fa33;
              }
              if (0x54 < bVar10) goto LAB_0048066e;
            }
            else {
              if (bVar10 < 0x73) {
                if (0x60 < bVar10 || bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047e0be;
              }
              if (bVar10 == 0x73) goto LAB_0047e92c;
              if (0x74 < bVar10) {
                if (bVar10 < 0x7b) goto LAB_0048066e;
                goto LAB_0047e0be;
              }
            }
            pbVar20 = pbVar22 + 3;
            bVar10 = pbVar22[3];
            if (0x39 < bVar10) {
              if (bVar10 < 0x5f) {
                if ((byte)(bVar10 + 0xbf) < 0x1a) goto LAB_0048066e;
              }
              else if (bVar10 != 0x60 && bVar10 < 0x7b) goto LAB_0048066e;
LAB_0047f942:
              *piVar1 = 0x140;
              goto LAB_0047b3e0;
            }
            if (0x31 < bVar10) {
              if (bVar10 != 0x38) goto LAB_0048066e;
              pbVar20 = pbVar22 + 4;
              bVar10 = pbVar22[4];
              if (bVar10 < 0x5b) {
                bVar25 = 0x2f < bVar10;
                bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
              }
              else {
                if (bVar10 < 0x60) {
                  if (bVar10 == 0x5f) goto LAB_0048066e;
                  goto LAB_00480276;
                }
                bVar25 = bVar10 != 0x60;
                bVar24 = bVar10 < 0x7b;
              }
              if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_00480276:
              *piVar1 = 0x13c;
              goto LAB_0047b3e0;
            }
            if (bVar10 < 0x30) goto LAB_0047f942;
            if (bVar10 != 0x31) goto LAB_0048066e;
            bVar10 = pbVar22[4];
            if (bVar10 == 0x36) {
              pbVar20 = pbVar22 + 5;
              bVar10 = pbVar22[5];
              if (bVar10 < 0x5b) {
                bVar25 = 0x2f < bVar10;
                bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
              }
              else {
                if (bVar10 < 0x60) {
                  if (bVar10 == 0x5f) goto LAB_0048066e;
                  goto LAB_004804ba;
                }
                bVar25 = bVar10 != 0x60;
                bVar24 = bVar10 < 0x7b;
              }
              if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_004804ba:
              *piVar1 = 0x13e;
              goto LAB_0047b3e0;
            }
            goto LAB_0047f9b1;
          }
          if (bVar10 != 0x53) goto switchD_0047bd6e_caseD_6a;
LAB_0047cdfb:
          pbVar20 = pbVar22 + 2;
          bVar10 = pbVar22[2];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_0047e900;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047e900:
          *piVar1 = 0x178;
          goto LAB_0047b3e0;
        }
        if (bVar10 != 0x46) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (0x6d < bVar10) {
          if (bVar10 == 0x6e) goto LAB_0047d564;
          if (bVar10 != 0x73) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047cdfb;
        }
        if (bVar10 != 0x66) goto switchD_0047bd6e_caseD_6a;
      }
      pbVar20 = pbVar22 + 2;
      bVar10 = pbVar22[2];
      if (bVar10 < 0x5b) {
        bVar25 = 0x2f < bVar10;
        bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
      }
      else {
        if (bVar10 < 0x60) {
          if (bVar10 == 0x5f) goto LAB_0048066e;
          goto LAB_0047e54b;
        }
        bVar25 = bVar10 != 0x60;
        bVar24 = bVar10 < 0x7b;
      }
      if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047e54b:
      *piVar1 = 0x12e;
      goto LAB_0047b3e0;
    case 0x4c:
    case 0x6c:
      pbVar20 = pbVar22 + 1;
      bVar10 = pbVar22[1];
      if (bVar10 < 0x50) {
        if (0x45 < bVar10) {
          if (bVar10 == 0x49) goto LAB_0047cf8c;
          if (bVar10 != 0x4f) goto switchD_0047bd6e_caseD_6a;
LAB_0047dae6:
          pbVar20 = pbVar22 + 2;
          bVar10 = pbVar22[2];
          if (bVar10 < 0x4f) {
            if (bVar10 == 0x43) {
LAB_0047e330:
              bVar10 = pbVar22[3];
              if ((bVar10 & 0xdf) != 0x41) goto LAB_0047efcd;
              bVar10 = pbVar22[4];
              if ((bVar10 & 0xdf) != 0x4c) goto LAB_0047f9b1;
              bVar10 = pbVar22[5];
              if ((bVar10 & 0xdf) == 0x49) {
                bVar10 = pbVar22[6];
                if ((bVar10 & 0xdf) == 0x5a) {
                  bVar10 = pbVar22[7];
                  if ((bVar10 & 0xdf) == 0x45) {
                    bVar10 = pbVar22[8];
                    if ((bVar10 & 0xdf) == 0x44) {
                      pbVar20 = pbVar22 + 9;
                      bVar10 = pbVar22[9];
                      if (bVar10 < 0x5b) {
                        bVar25 = 0x2f < bVar10;
                        bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                      }
                      else {
                        if (bVar10 < 0x60) {
                          if (bVar10 == 0x5f) goto LAB_0048066e;
                          goto LAB_00480468;
                        }
                        bVar25 = bVar10 != 0x60;
                        bVar24 = bVar10 < 0x7b;
                      }
                      if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_00480468:
                      *piVar1 = 0x169;
                      goto LAB_0047b3e0;
                    }
                    goto LAB_0047febb;
                  }
                  goto LAB_0047f9c3;
                }
                goto LAB_0047f9ba;
              }
              goto LAB_0047fa33;
            }
            if (bVar10 != 0x4e) goto switchD_0047bd6e_caseD_6a;
          }
          else {
            if (bVar10 < 100) {
              if (bVar10 != 99) goto switchD_0047bd6e_caseD_6a;
              goto LAB_0047e330;
            }
            if (bVar10 != 0x6e) goto switchD_0047bd6e_caseD_6a;
          }
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) == 0x47) {
            pbVar20 = pbVar22 + 4;
            bVar10 = pbVar22[4];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047f77f;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f77f:
            *piVar1 = 0x142;
            goto LAB_0047b3e0;
          }
          goto LAB_0047efcd;
        }
        if (bVar10 == 0x41) {
LAB_0047d5f8:
          bVar10 = pbVar22[2];
          if ((bVar10 & 0xdf) != 0x54) goto LAB_0047e41c;
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x45) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x4e) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) == 0x54) {
            pbVar20 = pbVar22 + 6;
            bVar10 = pbVar22[6];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047fbf7;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047fbf7:
            *piVar1 = 0x16a;
            goto LAB_0047b3e0;
          }
          goto LAB_0047fa33;
        }
        if (bVar10 != 0x45) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (0x65 < bVar10) {
          if (0x69 < bVar10) {
            if (bVar10 != 0x6f) goto switchD_0047bd6e_caseD_6a;
            goto LAB_0047dae6;
          }
          if (bVar10 != 0x69) goto switchD_0047bd6e_caseD_6a;
LAB_0047cf8c:
          bVar10 = pbVar22[2];
          if ((bVar10 & 0xdf) != 0x47) goto LAB_0047e41c;
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x48) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x54) goto LAB_0047f9b1;
          pbVar20 = pbVar22 + 5;
          bVar10 = pbVar22[5];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
LAB_0047f8d5:
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
          }
          else {
            if (0x5f < bVar10) {
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
              goto LAB_0047f8d5;
            }
            if (bVar10 == 0x5f) goto LAB_0048066e;
          }
          bVar25 = this->StateOptions == false;
          iVar11 = 0x18a;
          goto LAB_004802fe;
        }
        if (bVar10 == 0x61) goto LAB_0047d5f8;
        if (bVar10 != 0x65) goto switchD_0047bd6e_caseD_6a;
      }
      bVar10 = pbVar22[2];
      if ((bVar10 & 0xdf) == 0x54) {
        pbVar20 = pbVar22 + 3;
        bVar10 = pbVar22[3];
        if (bVar10 < 0x5b) {
          bVar25 = 0x2f < bVar10;
          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
        }
        else {
          if (bVar10 < 0x60) {
            if (bVar10 == 0x5f) goto LAB_0048066e;
            goto LAB_0047ef94;
          }
          bVar25 = bVar10 != 0x60;
          bVar24 = bVar10 < 0x7b;
        }
        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047ef94:
        *piVar1 = 399;
        goto LAB_0047b3e0;
      }
      goto LAB_0047e41c;
    case 0x4d:
    case 0x6d:
      pbVar20 = pbVar22 + 1;
      bVar10 = pbVar22[1];
      if (bVar10 < 0x46) {
        if (bVar10 == 0x41) {
LAB_0047c34c:
          bVar10 = pbVar22[2];
          if ((bVar10 & 0xdf) == 0x50) {
            pbVar20 = pbVar22 + 3;
            bVar10 = pbVar22[3];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047eac7;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047eac7:
            *piVar1 = 0x17c;
            goto LAB_0047b3e0;
          }
          goto LAB_0047e41c;
        }
        if (bVar10 != 0x45) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (bVar10 < 0x62) {
          if (bVar10 != 0x61) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047c34c;
        }
        if (bVar10 != 0x65) goto switchD_0047bd6e_caseD_6a;
      }
      bVar10 = pbVar22[2];
      if ((bVar10 & 0xdf) != 0x54) goto LAB_0047e41c;
      bVar10 = pbVar22[3];
      if ((bVar10 & 0xdf) == 0x41) {
        pbVar20 = pbVar22 + 4;
        bVar10 = pbVar22[4];
        if (bVar10 < 0x5b) {
          bVar25 = 0x2f < bVar10;
          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
        }
        else {
          if (bVar10 < 0x60) {
            if (bVar10 == 0x5f) goto LAB_0048066e;
            goto LAB_0047efe8;
          }
          bVar25 = bVar10 != 0x60;
          bVar24 = bVar10 < 0x7b;
        }
        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047efe8:
        *piVar1 = 0x185;
        goto LAB_0047b3e0;
      }
      goto LAB_0047efcd;
    case 0x4e:
    case 0x6e:
      pbVar20 = pbVar22 + 1;
      bVar10 = pbVar22[1];
      if (bVar10 < 0x56) {
        if (bVar10 < 0x46) {
          if (bVar10 != 0x41) {
            if (bVar10 != 0x45) goto switchD_0047bd6e_caseD_6a;
LAB_0047c4e8:
            bVar10 = pbVar22[2];
            if ((bVar10 & 0xdf) == 0x57) {
              pbVar20 = pbVar22 + 3;
              bVar10 = pbVar22[3];
              if (bVar10 < 0x5b) {
                bVar25 = 0x2f < bVar10;
                bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
              }
              else {
                if (bVar10 < 0x60) {
                  if (bVar10 == 0x5f) goto LAB_0048066e;
                  goto LAB_0047eefc;
                }
                bVar25 = bVar10 != 0x60;
                bVar24 = bVar10 < 0x7b;
              }
              if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047eefc:
              *piVar1 = 0x153;
              goto LAB_0047b3e0;
            }
            goto LAB_0047e41c;
          }
LAB_0047d53b:
          pbVar20 = pbVar22 + 2;
          bVar10 = pbVar22[2];
          if (bVar10 < 0x55) {
            if (bVar10 == 0x4d) {
LAB_0047e061:
              bVar10 = pbVar22[3];
              if ((bVar10 & 0xdf) == 0x45) {
                pbVar20 = pbVar22 + 4;
                bVar10 = pbVar22[4];
                if (bVar10 < 0x5b) {
                  bVar25 = 0x2f < bVar10;
                  bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                }
                else {
                  if (bVar10 < 0x60) {
                    if (bVar10 == 0x5f) goto LAB_0048066e;
                    goto LAB_0047f69b;
                  }
                  bVar25 = bVar10 != 0x60;
                  bVar24 = bVar10 < 0x7b;
                }
                if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f69b:
                *piVar1 = 0x148;
                goto LAB_0047b3e0;
              }
              goto LAB_0047efcd;
            }
            if (bVar10 != 0x54) goto switchD_0047bd6e_caseD_6a;
          }
          else {
            if (bVar10 < 0x6e) {
              if (bVar10 != 0x6d) goto switchD_0047bd6e_caseD_6a;
              goto LAB_0047e061;
            }
            if (bVar10 != 0x74) goto switchD_0047bd6e_caseD_6a;
          }
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x49) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x56) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) == 0x45) {
            pbVar20 = pbVar22 + 6;
            bVar10 = pbVar22[6];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047fd79;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047fd79:
            *piVar1 = 0x158;
            goto LAB_0047b3e0;
          }
          goto LAB_0047fa33;
        }
        if (bVar10 != 0x4f) {
          if (bVar10 != 0x55) goto switchD_0047bd6e_caseD_6a;
LAB_0047d989:
          bVar10 = pbVar22[2];
          if ((bVar10 & 0xdf) != 0x4c) goto LAB_0047e41c;
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) == 0x4c) {
            pbVar20 = pbVar22 + 4;
            bVar10 = pbVar22[4];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047f435;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f435:
            *piVar1 = 0x174;
            goto LAB_0047b3e0;
          }
          goto LAB_0047efcd;
        }
      }
      else {
        if (bVar10 < 0x66) {
          if (bVar10 != 0x61) {
            if (bVar10 != 0x65) goto switchD_0047bd6e_caseD_6a;
            goto LAB_0047c4e8;
          }
          goto LAB_0047d53b;
        }
        if (0x6f < bVar10) {
          if (bVar10 != 0x75) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047d989;
        }
        if (bVar10 != 0x6f) goto switchD_0047bd6e_caseD_6a;
      }
      pbVar20 = pbVar22 + 2;
      bVar10 = pbVar22[2];
      if (bVar10 < 0x4f) {
        if (bVar10 == 0x44) {
LAB_0047e284:
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x45) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x4c) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) != 0x41) goto LAB_0047fa33;
          bVar10 = pbVar22[6];
          if ((bVar10 & 0xdf) != 0x59) goto LAB_0047f9ba;
          pbVar20 = pbVar22 + 7;
          bVar10 = pbVar22[7];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
LAB_00480124:
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
          }
          else {
            if (0x5f < bVar10) {
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
              goto LAB_00480124;
            }
            if (bVar10 == 0x5f) goto LAB_0048066e;
          }
          bVar25 = this->StateOptions == false;
          iVar11 = 0x18b;
          goto LAB_004802fe;
        }
        if (bVar10 != 0x4e) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (bVar10 < 0x65) {
          if (bVar10 != 100) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047e284;
        }
        if (bVar10 != 0x6e) goto switchD_0047bd6e_caseD_6a;
      }
      bVar10 = pbVar22[3];
      if ((bVar10 & 0xdf) == 0x45) {
        pbVar20 = pbVar22 + 4;
        bVar10 = pbVar22[4];
        if (bVar10 < 0x5b) {
          bVar25 = 0x2f < bVar10;
          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
        }
        else {
          if (bVar10 < 0x60) {
            if (bVar10 == 0x5f) goto LAB_0048066e;
            goto LAB_0047f760;
          }
          bVar25 = bVar10 != 0x60;
          bVar24 = bVar10 < 0x7b;
        }
        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f760:
        *piVar1 = 0x152;
        goto LAB_0047b3e0;
      }
      goto LAB_0047efcd;
    case 0x4f:
    case 0x6f:
      pbVar20 = pbVar22 + 1;
      bVar10 = pbVar22[1];
      if (bVar10 < 0x57) {
        if (0x4f < bVar10) {
          if (bVar10 == 0x50) {
LAB_0047cce7:
            bVar10 = pbVar22[2];
            if ((bVar10 & 0xdf) != 0x54) goto LAB_0047e41c;
            bVar10 = pbVar22[3];
            if ((bVar10 & 0xdf) != 0x49) goto LAB_0047efcd;
            bVar10 = pbVar22[4];
            if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047f9b1;
            bVar10 = pbVar22[5];
            if ((bVar10 & 0xdf) == 0x4e) {
              bVar10 = pbVar22[6];
              if ((bVar10 & 0xdf) == 0x41) {
                bVar10 = pbVar22[7];
                if ((bVar10 & 0xdf) == 0x4c) {
                  pbVar20 = pbVar22 + 8;
                  bVar10 = pbVar22[8];
                  if (bVar10 < 0x5b) {
                    bVar25 = 0x2f < bVar10;
                    bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                  }
                  else {
                    if (bVar10 < 0x60) {
                      if (bVar10 == 0x5f) goto LAB_0048066e;
                      goto LAB_00480086;
                    }
                    bVar25 = bVar10 != 0x60;
                    bVar24 = bVar10 < 0x7b;
                  }
                  if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_00480086:
                  *piVar1 = 0x16f;
                  goto LAB_0047b3e0;
                }
                goto LAB_0047f9c3;
              }
              goto LAB_0047f9ba;
            }
            goto LAB_0047fa33;
          }
          if (bVar10 < 0x55) goto switchD_0047bd6e_caseD_6a;
          if (bVar10 != 0x56) goto LAB_0047ded0;
LAB_0047d8f7:
          bVar10 = pbVar22[2];
          if ((bVar10 & 0xdf) != 0x45) goto LAB_0047e41c;
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x52) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x52) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) == 0x49) {
            bVar10 = pbVar22[6];
            if ((bVar10 & 0xdf) == 0x44) {
              bVar10 = pbVar22[7];
              if ((bVar10 & 0xdf) == 0x45) {
                pbVar20 = pbVar22 + 8;
                bVar10 = pbVar22[8];
                if (bVar10 < 0x5b) {
                  bVar25 = 0x2f < bVar10;
                  bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                }
                else {
                  if (bVar10 < 0x60) {
                    if (bVar10 == 0x5f) goto LAB_0048066e;
                    goto LAB_0048043e;
                  }
                  bVar25 = bVar10 != 0x60;
                  bVar24 = bVar10 < 0x7b;
                }
                if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0048043e:
                *piVar1 = 0x172;
                goto LAB_0047b3e0;
              }
              goto LAB_0047f9c3;
            }
            goto LAB_0047f9ba;
          }
          goto LAB_0047fa33;
        }
        if (bVar10 != 0x46) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (0x70 < bVar10) {
          if (bVar10 < 0x75) goto switchD_0047bd6e_caseD_6a;
          if (bVar10 == 0x75) {
LAB_0047ded0:
            bVar10 = pbVar22[2];
            if ((bVar10 & 0xdf) == 0x54) {
              pbVar20 = pbVar22 + 3;
              bVar10 = pbVar22[3];
              if (bVar10 < 0x5b) {
                bVar25 = 0x2f < bVar10;
                bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
              }
              else {
                if (bVar10 < 0x60) {
                  if (bVar10 == 0x5f) goto LAB_0048066e;
                  goto LAB_0047f2ac;
                }
                bVar25 = bVar10 != 0x60;
                bVar24 = bVar10 < 0x7b;
              }
              if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f2ac:
              *piVar1 = 0x15a;
              goto LAB_0047b3e0;
            }
            goto LAB_0047e41c;
          }
          if (0x76 < bVar10) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047d8f7;
        }
        if (bVar10 != 0x66) {
          if (bVar10 != 0x70) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047cce7;
        }
      }
      bVar10 = pbVar22[2];
      if ((bVar10 & 0xdf) != 0x46) goto LAB_0047e41c;
      bVar10 = pbVar22[3];
      if ((bVar10 & 0xdf) != 0x53) goto LAB_0047efcd;
      bVar10 = pbVar22[4];
      if ((bVar10 & 0xdf) != 0x45) goto LAB_0047f9b1;
      bVar10 = pbVar22[5];
      if ((bVar10 & 0xdf) != 0x54) goto LAB_0047fa33;
      pbVar20 = pbVar22 + 6;
      bVar10 = pbVar22[6];
      if (bVar10 < 0x5b) {
        bVar25 = 0x2f < bVar10;
        bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
LAB_0047fac6:
        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
      }
      else {
        if (0x5f < bVar10) {
          bVar25 = bVar10 != 0x60;
          bVar24 = bVar10 < 0x7b;
          goto LAB_0047fac6;
        }
        if (bVar10 == 0x5f) goto LAB_0048066e;
      }
      bVar25 = this->StateOptions == false;
      iVar11 = 0x18c;
      goto LAB_004802fe;
    case 0x50:
    case 0x70:
      pbVar20 = pbVar22 + 1;
      bVar10 = pbVar22[1];
      if (bVar10 < 0x56) {
        if (bVar10 == 0x52) {
LAB_0047c304:
          pbVar20 = pbVar22 + 2;
          bVar10 = pbVar22[2];
          if (bVar10 < 0x50) {
            if (bVar10 == 0x49) {
LAB_0047d674:
              bVar10 = pbVar22[3];
              if ((bVar10 & 0xdf) != 0x56) goto LAB_0047efcd;
              bVar10 = pbVar22[4];
              if ((bVar10 & 0xdf) != 0x41) goto LAB_0047f9b1;
              bVar10 = pbVar22[5];
              if ((bVar10 & 0xdf) == 0x54) {
                bVar10 = pbVar22[6];
                if ((bVar10 & 0xdf) == 0x45) {
                  pbVar20 = pbVar22 + 7;
                  bVar10 = pbVar22[7];
                  if (bVar10 < 0x5b) {
                    bVar25 = 0x2f < bVar10;
                    bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                  }
                  else {
                    if (bVar10 < 0x60) {
                      if (bVar10 == 0x5f) goto LAB_0048066e;
                      goto LAB_0047fdca;
                    }
                    bVar25 = bVar10 != 0x60;
                    bVar24 = bVar10 < 0x7b;
                  }
                  if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047fdca:
                  *piVar1 = 0x165;
                  goto LAB_0047b3e0;
                }
                goto LAB_0047f9ba;
              }
              goto LAB_0047fa33;
            }
            if (bVar10 != 0x4f) goto switchD_0047bd6e_caseD_6a;
          }
          else {
            if (bVar10 < 0x6a) {
              if (bVar10 != 0x69) goto switchD_0047bd6e_caseD_6a;
              goto LAB_0047d674;
            }
            if (bVar10 != 0x6f) goto switchD_0047bd6e_caseD_6a;
          }
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x54) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x45) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) == 0x43) {
            bVar10 = pbVar22[6];
            if ((bVar10 & 0xdf) == 0x54) {
              bVar10 = pbVar22[7];
              if ((bVar10 & 0xdf) == 0x45) {
                bVar10 = pbVar22[8];
                if ((bVar10 & 0xdf) == 0x44) {
                  pbVar20 = pbVar22 + 9;
                  bVar10 = pbVar22[9];
                  if (bVar10 < 0x5b) {
                    bVar25 = 0x2f < bVar10;
                    bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                  }
                  else {
                    if (bVar10 < 0x60) {
                      if (bVar10 == 0x5f) goto LAB_0048066e;
                      goto LAB_0048035e;
                    }
                    bVar25 = bVar10 != 0x60;
                    bVar24 = bVar10 < 0x7b;
                  }
                  if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0048035e:
                  *piVar1 = 0x164;
                  goto LAB_0047b3e0;
                }
                goto LAB_0047febb;
              }
              goto LAB_0047f9c3;
            }
            goto LAB_0047f9ba;
          }
          goto LAB_0047fa33;
        }
        if (bVar10 != 0x55) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (bVar10 < 0x73) {
          if (bVar10 != 0x72) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047c304;
        }
        if (bVar10 != 0x75) goto switchD_0047bd6e_caseD_6a;
      }
      bVar10 = pbVar22[2];
      if ((bVar10 & 0xdf) != 0x42) goto LAB_0047e41c;
      bVar10 = pbVar22[3];
      if ((bVar10 & 0xdf) != 0x4c) goto LAB_0047efcd;
      bVar10 = pbVar22[4];
      if ((bVar10 & 0xdf) != 0x49) goto LAB_0047f9b1;
      bVar10 = pbVar22[5];
      if ((bVar10 & 0xdf) == 0x43) {
        pbVar20 = pbVar22 + 6;
        bVar10 = pbVar22[6];
        if (bVar10 < 0x5b) {
          bVar25 = 0x2f < bVar10;
          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
        }
        else {
          if (bVar10 < 0x60) {
            if (bVar10 == 0x5f) goto LAB_0048066e;
            goto LAB_0047f851;
          }
          bVar25 = bVar10 != 0x60;
          bVar24 = bVar10 < 0x7b;
        }
        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f851:
        *piVar1 = 0x163;
        goto LAB_0047b3e0;
      }
      goto LAB_0047fa33;
    case 0x52:
    case 0x72:
      bVar10 = pbVar22[1];
      if ((bVar10 & 0xdf) != 0x45) {
LAB_0047c133:
        pbVar20 = pbVar22 + 1;
        goto switchD_0047bd6e_caseD_6a;
      }
      pbVar20 = pbVar22 + 2;
      bVar10 = pbVar22[2];
      if (bVar10 < 0x55) {
        if (0x46 < bVar10) {
          if (bVar10 == 0x50) {
LAB_0047da66:
            bVar10 = pbVar22[3];
            if ((bVar10 & 0xdf) != 0x4c) goto LAB_0047efcd;
            bVar10 = pbVar22[4];
            if ((bVar10 & 0xdf) != 0x41) goto LAB_0047f9b1;
            bVar10 = pbVar22[5];
            if ((bVar10 & 0xdf) == 0x43) {
              bVar10 = pbVar22[6];
              if ((bVar10 & 0xdf) == 0x45) {
                bVar10 = pbVar22[7];
                if ((bVar10 & 0xdf) == 0x53) {
                  pbVar20 = pbVar22 + 8;
                  bVar10 = pbVar22[8];
                  if (bVar10 < 0x5b) {
                    bVar25 = 0x2f < bVar10;
                    bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                  }
                  else {
                    if (bVar10 < 0x60) {
                      if (bVar10 == 0x5f) goto LAB_0048066e;
                      goto LAB_004801ea;
                    }
                    bVar25 = bVar10 != 0x60;
                    bVar24 = bVar10 < 0x7b;
                  }
                  if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_004801ea:
                  *piVar1 = 0x179;
                  goto LAB_0047b3e0;
                }
                goto LAB_0047f9c3;
              }
              goto LAB_0047f9ba;
            }
            goto LAB_0047fa33;
          }
          if (bVar10 != 0x54) goto switchD_0047bd6e_caseD_6a;
LAB_0047e560:
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x55) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x52) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) == 0x4e) {
            pbVar20 = pbVar22 + 6;
            bVar10 = pbVar22[6];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047fc66;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047fc66:
            *piVar1 = 0x12f;
            goto LAB_0047b3e0;
          }
          goto LAB_0047fa33;
        }
        if (bVar10 == 0x41) {
LAB_0047e11b:
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x44) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) == 0x4e) {
            bVar10 = pbVar22[6];
            if ((bVar10 & 0xdf) == 0x4c) {
              bVar10 = pbVar22[7];
              if ((bVar10 & 0xdf) == 0x59) {
                pbVar20 = pbVar22 + 8;
                bVar10 = pbVar22[8];
                if (bVar10 < 0x5b) {
                  bVar25 = 0x2f < bVar10;
                  bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                }
                else {
                  if (bVar10 < 0x60) {
                    if (bVar10 == 0x5f) goto LAB_0048066e;
                    goto LAB_004801ac;
                  }
                  bVar25 = bVar10 != 0x60;
                  bVar24 = bVar10 < 0x7b;
                }
                if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_004801ac:
                *piVar1 = 0x187;
                goto LAB_0047b3e0;
              }
              goto LAB_0047f9c3;
            }
            goto LAB_0047f9ba;
          }
          goto LAB_0047fa33;
        }
        if (bVar10 != 0x46) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (0x66 < bVar10) {
          if (bVar10 < 0x71) {
            if (bVar10 != 0x70) goto switchD_0047bd6e_caseD_6a;
            goto LAB_0047da66;
          }
          if (bVar10 != 0x74) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047e560;
        }
        if (bVar10 == 0x61) goto LAB_0047e11b;
        if (bVar10 != 0x66) goto switchD_0047bd6e_caseD_6a;
      }
      pbVar20 = pbVar22 + 3;
      bVar10 = pbVar22[3];
      if (bVar10 < 0x5b) {
        bVar25 = 0x2f < bVar10;
        bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
      }
      else {
        if (bVar10 < 0x60) {
          if (bVar10 == 0x5f) goto LAB_0048066e;
          goto LAB_0047ef75;
        }
        bVar25 = bVar10 != 0x60;
        bVar24 = bVar10 < 0x7b;
      }
      if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047ef75:
      *piVar1 = 0x15b;
      goto LAB_0047b3e0;
    case 0x53:
    case 0x73:
      pbVar20 = pbVar22 + 1;
      bVar10 = pbVar22[1];
      switch(bVar10) {
      case 0x48:
        goto switchD_0047bd6e_caseD_68;
      case 0x49:
switchD_0047bd6e_caseD_69:
        pbVar20 = pbVar22 + 2;
        bVar10 = pbVar22[2];
        if (bVar10 < 0x5b) {
          if (bVar10 == 0x4e) {
LAB_0047e66c:
            bVar10 = pbVar22[3];
            if ((bVar10 & 0xdf) != 0x47) goto LAB_0047efcd;
            bVar10 = pbVar22[4];
            if ((bVar10 & 0xdf) != 0x55) goto LAB_0047f9b1;
            bVar10 = pbVar22[5];
            if ((bVar10 & 0xdf) == 0x4c) {
              bVar10 = pbVar22[6];
              if ((bVar10 & 0xdf) != 0x41) {
LAB_0047f9ba:
                pbVar20 = pbVar22 + 6;
                goto switchD_0047bd6e_caseD_6a;
              }
              bVar10 = pbVar22[7];
              if ((bVar10 & 0xdf) != 0x52) {
LAB_0047f9c3:
                pbVar20 = pbVar22 + 7;
                goto switchD_0047bd6e_caseD_6a;
              }
              pbVar20 = pbVar22 + 8;
              bVar10 = pbVar22[8];
              if (bVar10 < 0x5b) {
                bVar25 = 0x2f < bVar10;
                bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
              }
              else {
                if (bVar10 < 0x60) {
                  if (bVar10 == 0x5f) goto LAB_0048066e;
                  goto LAB_0048041f;
                }
                bVar25 = bVar10 != 0x60;
                bVar24 = bVar10 < 0x7b;
              }
              if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0048041f:
              *piVar1 = 0x16b;
              goto LAB_0047b3e0;
            }
            goto LAB_0047fa33;
          }
          if (bVar10 != 0x5a) goto switchD_0047bd6e_caseD_6a;
        }
        else {
          if (bVar10 < 0x6f) {
            if (bVar10 != 0x6e) goto switchD_0047bd6e_caseD_6a;
            goto LAB_0047e66c;
          }
          if (bVar10 != 0x7a) goto switchD_0047bd6e_caseD_6a;
        }
        bVar10 = pbVar22[3];
        if ((bVar10 & 0xdf) != 0x45) goto LAB_0047efcd;
        bVar10 = pbVar22[4];
        if ((bVar10 & 0xdf) == 0x4f) {
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) != 0x46) {
LAB_0047fa33:
            pbVar20 = pbVar22 + 5;
            goto switchD_0047bd6e_caseD_6a;
          }
          pbVar20 = pbVar22 + 6;
          bVar10 = pbVar22[6];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_0047ffe9;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047ffe9:
          *piVar1 = 0x17f;
          goto LAB_0047b3e0;
        }
        goto LAB_0047f9b1;
      case 0x4a:
      case 0x4b:
      case 0x4d:
      case 0x4e:
      case 0x50:
      case 0x51:
      case 0x52:
      case 0x53:
      case 0x56:
        goto switchD_0047bd6e_caseD_6a;
      case 0x4c:
switchD_0047bd6e_caseD_6c:
        bVar10 = pbVar22[2];
        if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047e41c;
        bVar10 = pbVar22[3];
        if ((bVar10 & 0xdf) != 0x57) goto LAB_0047efcd;
        pbVar20 = pbVar22 + 4;
        bVar10 = pbVar22[4];
        if (bVar10 < 0x5b) {
          bVar25 = 0x2f < bVar10;
          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
LAB_0047f541:
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
        }
        else {
          if (0x5f < bVar10) {
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
            goto LAB_0047f541;
          }
          if (bVar10 == 0x5f) goto LAB_0048066e;
        }
        bVar25 = this->StateOptions == false;
        iVar11 = 0x18d;
LAB_004802fe:
        iVar16 = 0x101;
        if (!bVar25) {
          iVar16 = iVar11;
        }
        this->TokenType = iVar16;
        goto LAB_0047b3e0;
      case 0x4f:
switchD_0047bd6e_caseD_6f:
        bVar10 = pbVar22[2];
        if ((bVar10 & 0xdf) != 0x55) goto LAB_0047e41c;
        bVar10 = pbVar22[3];
        if ((bVar10 & 0xdf) != 0x4e) goto LAB_0047efcd;
        bVar10 = pbVar22[4];
        if ((bVar10 & 0xdf) == 0x44) {
          pbVar20 = pbVar22 + 5;
          bVar10 = pbVar22[5];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_0047fa80;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047fa80:
          *piVar1 = 0x14a;
          goto LAB_0047b3e0;
        }
        goto LAB_0047f9b1;
      case 0x54:
switchD_0047bd6e_caseD_74:
        pbVar20 = pbVar22 + 2;
        bVar10 = pbVar22[2];
        if (bVar10 < 0x53) {
          if (0x4e < bVar10) {
            if (bVar10 == 0x4f) {
LAB_0047efa1:
              bVar10 = pbVar22[3];
              if ((bVar10 & 0xdf) == 0x50) {
                pbVar20 = pbVar22 + 4;
                bVar10 = pbVar22[4];
                if (bVar10 < 0x5b) {
                  bVar25 = 0x2f < bVar10;
                  bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                }
                else {
                  if (bVar10 < 0x60) {
                    if (bVar10 == 0x5f) goto LAB_0048066e;
                    goto LAB_0048064d;
                  }
                  bVar25 = bVar10 != 0x60;
                  bVar24 = bVar10 < 0x7b;
                }
                if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
                goto LAB_0048064d;
              }
              goto LAB_0047efcd;
            }
            if (bVar10 != 0x52) goto switchD_0047bd6e_caseD_6a;
LAB_0047ed7e:
            pbVar20 = pbVar22 + 3;
            bVar10 = pbVar22[3];
            if (bVar10 < 0x56) {
              if (bVar10 == 0x49) {
LAB_0047f3ce:
                bVar10 = pbVar22[4];
                if ((bVar10 & 0xdf) != 0x4e) goto LAB_0047f9b1;
                bVar10 = pbVar22[5];
                if ((bVar10 & 0xdf) == 0x47) {
                  pbVar20 = pbVar22 + 6;
                  bVar10 = pbVar22[6];
                  if (bVar10 < 0x5b) {
                    bVar25 = 0x2f < bVar10;
                    bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                  }
                  else {
                    if (bVar10 < 0x60) {
                      if (bVar10 == 0x5f) goto LAB_0048066e;
                      goto LAB_00480320;
                    }
                    bVar25 = bVar10 != 0x60;
                    bVar24 = bVar10 < 0x7b;
                  }
                  if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_00480320:
                  *piVar1 = 0x149;
                  goto LAB_0047b3e0;
                }
                goto LAB_0047fa33;
              }
              if (bVar10 != 0x55) goto switchD_0047bd6e_caseD_6a;
            }
            else {
              if (bVar10 < 0x6a) {
                if (bVar10 != 0x69) goto switchD_0047bd6e_caseD_6a;
                goto LAB_0047f3ce;
              }
              if (bVar10 != 0x75) goto switchD_0047bd6e_caseD_6a;
            }
            bVar10 = pbVar22[4];
            if ((bVar10 & 0xdf) != 0x43) goto LAB_0047f9b1;
            bVar10 = pbVar22[5];
            if ((bVar10 & 0xdf) == 0x54) {
              pbVar20 = pbVar22 + 6;
              bVar10 = pbVar22[6];
              if (bVar10 < 0x5b) {
                bVar25 = 0x2f < bVar10;
                bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
              }
              else {
                if (bVar10 < 0x60) {
                  if (bVar10 == 0x5f) goto LAB_0048066e;
                  goto LAB_0048033f;
                }
                bVar25 = bVar10 != 0x60;
                bVar24 = bVar10 < 0x7b;
              }
              if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0048033f:
              *piVar1 = 0x145;
              goto LAB_0047b3e0;
            }
            goto LAB_0047fa33;
          }
          if (bVar10 != 0x41) goto switchD_0047bd6e_caseD_6a;
        }
        else {
          if (0x6e < bVar10) {
            if (bVar10 == 0x6f) goto LAB_0047efa1;
            if (bVar10 != 0x72) goto switchD_0047bd6e_caseD_6a;
            goto LAB_0047ed7e;
          }
          if (bVar10 != 0x61) goto switchD_0047bd6e_caseD_6a;
        }
        bVar10 = pbVar22[3];
        if ((bVar10 & 0xdf) != 0x54) goto LAB_0047efcd;
        pbVar20 = pbVar22 + 4;
        bVar10 = pbVar22[4];
        if (bVar10 < 0x4a) {
          if (bVar10 == 0x45) {
LAB_0047f513:
            pbVar20 = pbVar22 + 5;
            bVar10 = pbVar22[5];
            if (bVar10 < 0x5b) {
              if (bVar10 < 0x41) {
                if ((byte)(bVar10 - 0x30) < 10) goto LAB_0048066e;
                goto LAB_0048021e;
              }
              if (bVar10 != 0x53) goto LAB_0048066e;
            }
            else {
              if (bVar10 < 0x61) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
LAB_0048021e:
                *piVar1 = 0x14b;
                goto LAB_0047b3e0;
              }
              if (bVar10 != 0x73) {
                if (bVar10 < 0x7b) goto LAB_0048066e;
                goto LAB_0048021e;
              }
            }
            pbVar20 = pbVar22 + 6;
            bVar10 = pbVar22[6];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_00480400;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_00480400:
            *piVar1 = 0x181;
            goto LAB_0047b3e0;
          }
          if (bVar10 != 0x49) goto switchD_0047bd6e_caseD_6a;
        }
        else {
          if (bVar10 < 0x66) {
            if (bVar10 != 0x65) goto switchD_0047bd6e_caseD_6a;
            goto LAB_0047f513;
          }
          if (bVar10 != 0x69) goto switchD_0047bd6e_caseD_6a;
        }
        bVar10 = pbVar22[5];
        if ((bVar10 & 0xdf) == 0x43) {
          pbVar20 = pbVar22 + 6;
          bVar10 = pbVar22[6];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_00480209;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_00480209:
          *piVar1 = 0x15d;
          goto LAB_0047b3e0;
        }
        goto LAB_0047fa33;
      case 0x55:
switchD_0047bd6e_caseD_75:
        bVar10 = pbVar22[2];
        if ((bVar10 & 0xdf) != 0x50) goto LAB_0047e41c;
        bVar10 = pbVar22[3];
        if ((bVar10 & 0xdf) != 0x45) goto LAB_0047efcd;
        bVar10 = pbVar22[4];
        if ((bVar10 & 0xdf) == 0x52) {
          pbVar20 = pbVar22 + 5;
          bVar10 = pbVar22[5];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_0047f9f1;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f9f1:
          *piVar1 = 0x173;
          goto LAB_0047b3e0;
        }
        goto LAB_0047f9b1;
      case 0x57:
switchD_0047bd6e_caseD_77:
        bVar10 = pbVar22[2];
        if ((bVar10 & 0xdf) != 0x49) goto LAB_0047e41c;
        bVar10 = pbVar22[3];
        if ((bVar10 & 0xdf) != 0x54) goto LAB_0047efcd;
        bVar10 = pbVar22[4];
        if ((bVar10 & 0xdf) != 0x43) goto LAB_0047f9b1;
        bVar10 = pbVar22[5];
        if ((bVar10 & 0xdf) == 0x48) {
          pbVar20 = pbVar22 + 6;
          bVar10 = pbVar22[6];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_0047fcdf;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047fcdf:
          *piVar1 = 0x130;
          goto LAB_0047b3e0;
        }
        goto LAB_0047fa33;
      default:
        switch(bVar10) {
        case 0x68:
          goto switchD_0047bd6e_caseD_68;
        case 0x69:
          goto switchD_0047bd6e_caseD_69;
        case 0x6a:
        case 0x6b:
        case 0x6d:
        case 0x6e:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x73:
        case 0x76:
          goto switchD_0047bd6e_caseD_6a;
        case 0x6c:
          goto switchD_0047bd6e_caseD_6c;
        case 0x6f:
          goto switchD_0047bd6e_caseD_6f;
        case 0x74:
          goto switchD_0047bd6e_caseD_74;
        case 0x75:
          goto switchD_0047bd6e_caseD_75;
        case 0x77:
          goto switchD_0047bd6e_caseD_77;
        default:
          if ((bVar10 != 0x42) && (bVar10 != 0x62)) goto switchD_0047bd6e_caseD_6a;
          bVar10 = pbVar22[2];
          if ((bVar10 & 0xdf) != 0x59) goto LAB_0047e41c;
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x54) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x45) goto LAB_0047f9b1;
          pbVar20 = pbVar22 + 5;
          bVar10 = pbVar22[5];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_0047fb77;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047fb77:
          *piVar1 = 0x139;
          goto LAB_0047b3e0;
        }
      }
    case 0x54:
    case 0x74:
      pbVar20 = pbVar22 + 1;
      bVar10 = pbVar22[1];
      if (bVar10 < 0x53) {
        if (bVar10 == 0x48) {
LAB_0047c64e:
          bVar10 = pbVar22[2];
          if ((bVar10 & 0xdf) != 0x52) goto LAB_0047e41c;
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x57) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) == 0x53) {
            pbVar20 = pbVar22 + 6;
            bVar10 = pbVar22[6];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047f88f;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f88f:
            *piVar1 = 0x161;
            goto LAB_0047b3e0;
          }
          goto LAB_0047fa33;
        }
        if (bVar10 != 0x52) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (bVar10 < 0x69) {
          if (bVar10 != 0x68) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047c64e;
        }
        if (bVar10 != 0x72) goto switchD_0047bd6e_caseD_6a;
      }
      pbVar20 = pbVar22 + 2;
      bVar10 = pbVar22[2];
      if (bVar10 < 0x56) {
        if (bVar10 == 0x41) {
LAB_0047d6e8:
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x4e) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x53) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) == 0x49) {
            bVar10 = pbVar22[6];
            if ((bVar10 & 0xdf) == 0x45) {
              bVar10 = pbVar22[7];
              if ((bVar10 & 0xdf) == 0x4e) {
                bVar10 = pbVar22[8];
                if ((bVar10 & 0xdf) == 0x54) {
                  pbVar20 = pbVar22 + 9;
                  bVar10 = pbVar22[9];
                  if (bVar10 < 0x5b) {
                    bVar25 = 0x2f < bVar10;
                    bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                  }
                  else {
                    if (bVar10 < 0x60) {
                      if (bVar10 == 0x5f) goto LAB_0048066e;
                      goto LAB_0048039c;
                    }
                    bVar25 = bVar10 != 0x60;
                    bVar24 = bVar10 < 0x7b;
                  }
                  if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0048039c:
                  *piVar1 = 0x15e;
                  goto LAB_0047b3e0;
                }
                goto LAB_0047febb;
              }
              goto LAB_0047f9c3;
            }
            goto LAB_0047f9ba;
          }
          goto LAB_0047fa33;
        }
        if (bVar10 != 0x55) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (bVar10 < 0x62) {
          if (bVar10 != 0x61) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047d6e8;
        }
        if (bVar10 != 0x75) goto switchD_0047bd6e_caseD_6a;
      }
      bVar10 = pbVar22[3];
      if ((bVar10 & 0xdf) == 0x45) {
        pbVar20 = pbVar22 + 4;
        bVar10 = pbVar22[4];
        if (bVar10 < 0x5b) {
          bVar25 = 0x2f < bVar10;
          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
        }
        else {
          if (bVar10 < 0x60) {
            if (bVar10 == 0x5f) goto LAB_0048066e;
            goto LAB_0047f336;
          }
          bVar25 = bVar10 != 0x60;
          bVar24 = bVar10 < 0x7b;
        }
        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f336:
        *piVar1 = 0x150;
        goto LAB_0047b3e0;
      }
      goto LAB_0047efcd;
    case 0x55:
    case 0x75:
      bVar10 = pbVar22[1];
      if (bVar10 == 0x49) {
LAB_0047d18e:
        bVar10 = pbVar22[2];
        if ((bVar10 & 0xdf) != 0x4e) goto LAB_0047e41c;
        bVar10 = pbVar22[3];
        if ((bVar10 & 0xdf) != 0x54) goto LAB_0047efcd;
        pbVar20 = pbVar22 + 4;
        bVar10 = pbVar22[4];
        if (0x39 < bVar10) {
          if (bVar10 < 0x5f) {
            if ((byte)(bVar10 + 0xbf) < 0x1a) goto LAB_0048066e;
          }
          else if (bVar10 != 0x60 && bVar10 < 0x7b) goto LAB_0048066e;
LAB_0047f20f:
          *piVar1 = 0x141;
          goto LAB_0047b3e0;
        }
        if (bVar10 < 0x32) {
          if (bVar10 < 0x30) goto LAB_0047f20f;
          if (bVar10 != 0x31) goto LAB_0048066e;
          bVar10 = pbVar22[5];
          if (bVar10 != 0x36) goto LAB_0047fa33;
          pbVar20 = pbVar22 + 6;
          bVar10 = pbVar22[6];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_004802d3;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_004802d3:
          *piVar1 = 0x13f;
          goto LAB_0047b3e0;
        }
        if (bVar10 != 0x38) goto LAB_0048066e;
        pbVar20 = pbVar22 + 5;
        bVar10 = pbVar22[5];
        if (bVar10 < 0x5b) {
          bVar25 = 0x2f < bVar10;
          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
        }
        else {
          if (bVar10 < 0x60) {
            if (bVar10 == 0x5f) goto LAB_0048066e;
            goto LAB_0047fcfe;
          }
          bVar25 = bVar10 != 0x60;
          bVar24 = bVar10 < 0x7b;
        }
        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047fcfe:
        *piVar1 = 0x13d;
        goto LAB_0047b3e0;
      }
      if (bVar10 == 0x4c) {
LAB_0047d204:
        bVar10 = pbVar22[2];
        if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047e41c;
        bVar10 = pbVar22[3];
        if ((bVar10 & 0xdf) != 0x4e) goto LAB_0047efcd;
        bVar10 = pbVar22[4];
        if ((bVar10 & 0xdf) == 0x47) {
          pbVar20 = pbVar22 + 5;
          bVar10 = pbVar22[5];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_0047f5d3;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f5d3:
          *piVar1 = 0x143;
          goto LAB_0047b3e0;
        }
        goto LAB_0047f9b1;
      }
      if (bVar10 == 0x4e) {
LAB_0047d258:
        bVar10 = pbVar22[2];
        if ((bVar10 & 0xdf) != 0x54) goto LAB_0047e41c;
        bVar10 = pbVar22[3];
        if ((bVar10 & 0xdf) != 0x49) goto LAB_0047efcd;
        bVar10 = pbVar22[4];
        if ((bVar10 & 0xdf) == 0x4c) {
          pbVar20 = pbVar22 + 5;
          bVar10 = pbVar22[5];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_0047f5f2;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f5f2:
          *piVar1 = 0x131;
          goto LAB_0047b3e0;
        }
        goto LAB_0047f9b1;
      }
      if (bVar10 != 0x53) {
        if (bVar10 == 0x69) goto LAB_0047d18e;
        if (bVar10 == 0x6c) goto LAB_0047d204;
        if (bVar10 == 0x6e) goto LAB_0047d258;
        if (bVar10 != 0x73) goto LAB_0047cae5;
      }
      bVar10 = pbVar22[2];
      if ((bVar10 & 0xdf) != 0x48) goto LAB_0047e41c;
      bVar10 = pbVar22[3];
      if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047efcd;
      bVar10 = pbVar22[4];
      if ((bVar10 & 0xdf) != 0x52) goto LAB_0047f9b1;
      bVar10 = pbVar22[5];
      if ((bVar10 & 0xdf) == 0x54) {
        pbVar20 = pbVar22 + 6;
        bVar10 = pbVar22[6];
        if (bVar10 < 0x5b) {
          bVar25 = 0x2f < bVar10;
          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
        }
        else {
          if (bVar10 < 0x60) {
            if (bVar10 == 0x5f) goto LAB_0048066e;
            goto LAB_0047fab2;
          }
          bVar25 = bVar10 != 0x60;
          bVar24 = bVar10 < 0x7b;
        }
        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047fab2:
        *piVar1 = 0x13b;
        goto LAB_0047b3e0;
      }
      goto LAB_0047fa33;
    case 0x56:
    case 0x76:
      pbVar20 = pbVar22 + 1;
      bVar10 = pbVar22[1];
      if (bVar10 < 0x50) {
        if (0x45 < bVar10) {
          if (bVar10 == 0x49) {
LAB_0047cc67:
            bVar10 = pbVar22[2];
            if ((bVar10 & 0xdf) != 0x52) goto LAB_0047e41c;
            bVar10 = pbVar22[3];
            if ((bVar10 & 0xdf) != 0x54) goto LAB_0047efcd;
            bVar10 = pbVar22[4];
            if ((bVar10 & 0xdf) != 0x55) goto LAB_0047f9b1;
            bVar10 = pbVar22[5];
            if ((bVar10 & 0xdf) == 0x41) {
              bVar10 = pbVar22[6];
              if ((bVar10 & 0xdf) == 0x4c) {
                pbVar20 = pbVar22 + 7;
                bVar10 = pbVar22[7];
                if (bVar10 < 0x5b) {
                  bVar25 = 0x2f < bVar10;
                  bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                }
                else {
                  if (bVar10 < 0x60) {
                    if (bVar10 == 0x5f) goto LAB_0048066e;
                    goto LAB_0047ff43;
                  }
                  bVar25 = bVar10 != 0x60;
                  bVar24 = bVar10 < 0x7b;
                }
                if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047ff43:
                *piVar1 = 0x171;
                goto LAB_0047b3e0;
              }
              goto LAB_0047f9ba;
            }
            goto LAB_0047fa33;
          }
          if (bVar10 != 0x4f) goto switchD_0047bd6e_caseD_6a;
LAB_0047d8be:
          pbVar20 = pbVar22 + 2;
          bVar10 = pbVar22[2];
          if (bVar10 < 0x4d) {
            if (bVar10 == 0x49) {
LAB_0047e246:
              bVar10 = pbVar22[3];
              if ((bVar10 & 0xdf) == 0x44) {
                pbVar20 = pbVar22 + 4;
                bVar10 = pbVar22[4];
                if (bVar10 < 0x5b) {
                  bVar25 = 0x2f < bVar10;
                  bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                }
                else {
                  if (bVar10 < 0x60) {
                    if (bVar10 == 0x5f) goto LAB_0048066e;
                    goto LAB_0047f741;
                  }
                  bVar25 = bVar10 != 0x60;
                  bVar24 = bVar10 < 0x7b;
                }
                if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f741:
                *piVar1 = 0x144;
                goto LAB_0047b3e0;
              }
              goto LAB_0047efcd;
            }
            if (bVar10 != 0x4c) goto switchD_0047bd6e_caseD_6a;
          }
          else {
            if (bVar10 < 0x6a) {
              if (bVar10 != 0x69) goto switchD_0047bd6e_caseD_6a;
              goto LAB_0047e246;
            }
            if (bVar10 != 0x6c) goto switchD_0047bd6e_caseD_6a;
          }
          bVar10 = pbVar22[3];
          if ((bVar10 & 0xdf) != 0x41) goto LAB_0047efcd;
          bVar10 = pbVar22[4];
          if ((bVar10 & 0xdf) != 0x54) goto LAB_0047f9b1;
          bVar10 = pbVar22[5];
          if ((bVar10 & 0xdf) == 0x49) {
            bVar10 = pbVar22[6];
            if ((bVar10 & 0xdf) == 0x4c) {
              bVar10 = pbVar22[7];
              if ((bVar10 & 0xdf) == 0x45) {
                pbVar20 = pbVar22 + 8;
                bVar10 = pbVar22[8];
                if (bVar10 < 0x5b) {
                  bVar25 = 0x2f < bVar10;
                  bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
                }
                else {
                  if (bVar10 < 0x60) {
                    if (bVar10 == 0x5f) goto LAB_0048066e;
                    goto LAB_0048037d;
                  }
                  bVar25 = bVar10 != 0x60;
                  bVar24 = bVar10 < 0x7b;
                }
                if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0048037d:
                *piVar1 = 0x15f;
                goto LAB_0047b3e0;
              }
              goto LAB_0047f9c3;
            }
            goto LAB_0047f9ba;
          }
          goto LAB_0047fa33;
        }
        if (bVar10 == 0x41) {
LAB_0047d50b:
          bVar10 = pbVar22[2];
          if ((bVar10 & 0xdf) == 0x52) {
            pbVar20 = pbVar22 + 3;
            bVar10 = pbVar22[3];
            if (bVar10 < 0x5b) {
              bVar25 = 0x2f < bVar10;
              bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
            }
            else {
              if (bVar10 < 0x60) {
                if (bVar10 == 0x5f) goto LAB_0048066e;
                goto LAB_0047eedd;
              }
              bVar25 = bVar10 != 0x60;
              bVar24 = bVar10 < 0x7b;
            }
            if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047eedd:
            *piVar1 = 0x159;
            goto LAB_0047b3e0;
          }
          goto LAB_0047e41c;
        }
        if (bVar10 != 0x45) goto switchD_0047bd6e_caseD_6a;
      }
      else {
        if (0x65 < bVar10) {
          if (bVar10 < 0x6a) {
            if (bVar10 != 0x69) goto switchD_0047bd6e_caseD_6a;
            goto LAB_0047cc67;
          }
          if (bVar10 != 0x6f) goto switchD_0047bd6e_caseD_6a;
          goto LAB_0047d8be;
        }
        if (bVar10 == 0x61) goto LAB_0047d50b;
        if (bVar10 != 0x65) goto switchD_0047bd6e_caseD_6a;
      }
      bVar10 = pbVar22[2];
      if ((bVar10 & 0xdf) != 0x43) goto LAB_0047e41c;
      bVar10 = pbVar22[3];
      if ((bVar10 & 0xdf) != 0x54) goto LAB_0047efcd;
      bVar10 = pbVar22[4];
      if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047f9b1;
      bVar10 = pbVar22[5];
      if ((bVar10 & 0xdf) == 0x52) {
        pbVar20 = pbVar22 + 6;
        bVar10 = pbVar22[6];
        if (bVar10 < 0x32) goto switchD_0047bd6e_caseD_6a;
        if (bVar10 != 0x32) {
          if (0x33 < bVar10) goto switchD_0047bd6e_caseD_6a;
          pbVar20 = pbVar22 + 7;
          bVar10 = pbVar22[7];
          if (bVar10 < 0x5b) {
            bVar25 = 0x2f < bVar10;
            bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
          }
          else {
            if (bVar10 < 0x60) {
              if (bVar10 == 0x5f) goto LAB_0048066e;
              goto LAB_004803e1;
            }
            bVar25 = bVar10 != 0x60;
            bVar24 = bVar10 < 0x7b;
          }
          if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_004803e1:
          *piVar1 = 0x17b;
          goto LAB_0047b3e0;
        }
        pbVar20 = pbVar22 + 7;
        bVar10 = pbVar22[7];
        if (bVar10 < 0x5b) {
          bVar25 = 0x2f < bVar10;
          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
        }
        else {
          if (bVar10 < 0x60) {
            if (bVar10 == 0x5f) goto LAB_0048066e;
            goto LAB_0048018d;
          }
          bVar25 = bVar10 != 0x60;
          bVar24 = bVar10 < 0x7b;
        }
        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0048018d:
        *piVar1 = 0x17a;
        goto LAB_0047b3e0;
      }
      goto LAB_0047fa33;
    case 0x57:
    case 0x77:
      bVar10 = pbVar22[1];
      if ((bVar10 & 0xdf) != 0x48) goto LAB_0047c133;
      bVar10 = pbVar22[2];
      if ((bVar10 & 0xdf) != 0x49) goto LAB_0047e41c;
      bVar10 = pbVar22[3];
      if ((bVar10 & 0xdf) != 0x4c) goto LAB_0047efcd;
      bVar10 = pbVar22[4];
      if ((bVar10 & 0xdf) == 0x45) {
        pbVar20 = pbVar22 + 5;
        bVar10 = pbVar22[5];
        if (bVar10 < 0x5b) {
          bVar25 = 0x2f < bVar10;
          bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
        }
        else {
          if (bVar10 < 0x60) {
            if (bVar10 == 0x5f) goto LAB_0048066e;
            goto LAB_0047f0ee;
          }
          bVar25 = bVar10 != 0x60;
          bVar24 = bVar10 < 0x7b;
        }
        if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047f0ee:
        *piVar1 = 0x132;
        goto LAB_0047b3e0;
      }
      goto LAB_0047f9b1;
    case 0x5b:
      *piVar1 = 0x5b;
      pbVar20 = pbVar22 + 1;
      goto LAB_0047b3e0;
    case 0x5d:
      *piVar1 = 0x5d;
      pbVar20 = pbVar22 + 1;
      goto LAB_0047b3e0;
    case 0x5e:
      if (pbVar22[1] == 0x3d) {
        *piVar1 = 0x114;
        pbVar20 = pbVar22 + 2;
      }
      else {
        *piVar1 = 0x5e;
        pbVar20 = pbVar22 + 1;
      }
      goto LAB_0047b3e0;
    case 0x7b:
      this->StateOptions = false;
      this->TokenType = 0x7b;
      pbVar20 = pbVar22 + 1;
      goto LAB_0047b3e0;
    case 0x7c:
      if (pbVar22[1] == 0x3d) {
        *piVar1 = 0x115;
        pbVar20 = pbVar22 + 2;
      }
      else if (pbVar22[1] == 0x7c) {
        *piVar1 = 0x11c;
        pbVar20 = pbVar22 + 2;
      }
      else {
        *piVar1 = 0x7c;
        pbVar20 = pbVar22 + 1;
      }
      goto LAB_0047b3e0;
    case 0x7d:
      *piVar1 = 0x7d;
      pbVar20 = pbVar22 + 1;
      goto LAB_0047b3e0;
    case 0x7e:
      if ((pbVar22[1] == 0x3d) && (pbVar22[2] == 0x3d)) {
        *piVar1 = 0x121;
        pbVar20 = pbVar22 + 3;
      }
      else {
        *piVar1 = 0x7e;
        pbVar20 = pbVar22 + 1;
      }
      goto LAB_0047b3e0;
    }
    pbVar22 = pbVar22 + 1;
    ScriptError(this,"Unexpected character: %c (ASCII %d)\n",(ulong)(uint)(int)(char)bVar10);
    goto LAB_0047aaf0;
  }
  pbVar17 = pbVar22;
  if (bVar10 < 0x4d) {
    if (0x2f < bVar10) {
      if (bVar10 < 0x46) {
        if (bVar10 < 0x3a) goto LAB_00480585;
        if (bVar10 == 0x3a) {
          *piVar1 = 0x3a;
          pbVar20 = pbVar22 + 1;
        }
        else {
          if (0x3b < bVar10) goto LAB_00480585;
          *piVar1 = 0x3b;
          pbVar20 = pbVar22 + 1;
        }
        goto LAB_0047b3e0;
      }
      if (bVar10 == 0x46) {
LAB_0047b9be:
        bVar10 = pbVar22[1];
        if ((bVar10 & 0xdf) != 0x41) goto LAB_0047c1f9;
        bVar10 = pbVar22[2];
        if ((bVar10 & 0xdf) != 0x49) goto LAB_0047c1ff;
        bVar10 = pbVar22[3];
        if ((bVar10 & 0xdf) == 0x4c) {
          pbVar20 = pbVar22 + 4;
          bVar10 = pbVar22[4];
          if (bVar10 < 0x3a) {
            if (0x22 < bVar10 || bVar10 == 0x21) {
              bVar25 = true;
              bVar6 = false;
              bVar24 = true;
              bVar4 = false;
              bVar5 = true;
              goto LAB_0048059c;
            }
          }
          else {
            pbVar17 = pbVar20;
            if (0x3b < bVar10 && bVar10 != 0x7d) goto joined_r0x0047bbf2;
          }
          goto LAB_0048061c;
        }
        goto LAB_0047c205;
      }
      if (0x47 < bVar10) {
        if (bVar10 != 0x4c) goto LAB_00480585;
        goto LAB_0047b7b7;
      }
LAB_0047c193:
      bVar10 = pbVar22[1];
      bVar25 = true;
      if ((bVar10 & 0xdf) != 0x4f) {
LAB_0047c1f9:
        pbVar20 = pbVar22 + 1;
        goto LAB_00480596;
      }
      bVar10 = pbVar22[2];
      if ((bVar10 & 0xdf) != 0x54) {
LAB_0047c1ff:
        pbVar20 = pbVar22 + 2;
        goto LAB_00480596;
      }
      bVar10 = pbVar22[3];
      if ((bVar10 & 0xdf) != 0x4f) {
LAB_0047c205:
        pbVar20 = pbVar22 + 3;
        goto LAB_00480596;
      }
      pbVar20 = pbVar22 + 4;
      bVar10 = pbVar22[4];
      if (0x39 < bVar10) {
        pbVar17 = pbVar20;
        if (0x3b < bVar10 && bVar10 != 0x7d) goto joined_r0x0047bbf2;
        goto LAB_0048065a;
      }
      if (bVar10 < 0x23 && bVar10 != 0x21) goto LAB_0048065a;
      bVar6 = false;
      bVar24 = true;
      goto LAB_0047c1e9;
    }
    if (bVar10 < 0x22) {
      if (bVar10 != 10) {
        if (bVar10 == 0x21) goto LAB_00480585;
        do {
          pbVar18 = pbVar22 + 1;
          pbVar22 = pbVar22 + 1;
          if (*pbVar18 == 10) break;
        } while (*pbVar18 < 0x21);
        if (bVar10 < 0x22) goto LAB_0047aaf0;
        goto LAB_0047aea1;
      }
    }
    else {
      if (bVar10 == 0x22) goto LAB_0047b823;
      if (0x23 < bVar10) {
        if (bVar10 != 0x2f) goto LAB_00480585;
        pbVar17 = pbVar22 + 1;
        bVar10 = pbVar22[1];
        if (0x2e < bVar10) {
          if (0x3b < bVar10) goto joined_r0x0047bbf2;
          if (bVar10 != 0x2f) goto joined_r0x0047bc4b;
          do {
            pbVar22 = pbVar18 + 1;
            bVar10 = *pbVar18;
            pbVar18 = pbVar22;
          } while (bVar10 != 10);
          goto LAB_0047b234;
        }
        if (bVar10 < 0x23) goto joined_r0x0047bc02;
        if (bVar10 != 0x2a) goto LAB_00480585;
        goto LAB_0047ae9d;
      }
      bVar10 = pbVar22[1];
      if (bVar10 == 0x65) {
        bVar10 = pbVar22[2];
        if (bVar10 != 0x6e) {
          pbVar20 = pbVar22 + 2;
          goto LAB_00480596;
        }
        bVar10 = pbVar22[3];
        if (bVar10 != 100) {
          pbVar20 = pbVar22 + 3;
          goto LAB_00480596;
        }
        bVar10 = pbVar22[4];
        lVar13 = 4;
        if (bVar10 != 0x72) {
          pbVar20 = pbVar22 + 4;
          goto LAB_00480596;
        }
      }
      else {
        lVar13 = 1;
        if (bVar10 != 0x72) {
          pbVar20 = pbVar22 + 1;
          goto LAB_00480596;
        }
      }
      bVar10 = pbVar22[lVar13 + 1];
      if (bVar10 != 0x65) {
        pbVar20 = pbVar22 + lVar13 + 1;
        goto LAB_00480596;
      }
      bVar10 = pbVar22[lVar13 + 2];
      if (bVar10 != 0x67) {
        pbVar20 = pbVar22 + lVar13 + 2;
        goto LAB_00480596;
      }
      bVar10 = pbVar22[lVar13 + 3];
      if (bVar10 != 0x69) {
        pbVar20 = pbVar22 + lVar13 + 3;
        goto LAB_00480596;
      }
      bVar10 = pbVar22[lVar13 + 4];
      if (bVar10 != 0x6f) {
        pbVar20 = pbVar22 + lVar13 + 4;
        goto LAB_00480596;
      }
      bVar10 = pbVar22[lVar13 + 5];
      pbVar20 = pbVar22 + lVar13 + 5;
      if (bVar10 != 0x6e) goto LAB_00480596;
LAB_0047b074:
      do {
        while( true ) {
          pbVar15 = pbVar20 + 1;
          bVar10 = pbVar20[1];
          if (0x2e < bVar10) break;
          if (bVar10 < 0x21) {
LAB_0047b21d:
            if (bVar10 == 10) goto switchD_0047ad09_caseD_a;
            goto LAB_0047b224;
          }
LAB_0047b08a:
          pbVar20 = pbVar15;
          if (bVar10 == 0x22) goto LAB_0047b224;
        }
        if (bVar10 < 0x3c) {
          if (bVar10 != 0x2f) {
            pbVar20 = pbVar15;
            if (0x39 < bVar10) break;
            goto LAB_0047b074;
          }
          bVar10 = pbVar20[2];
          pbVar15 = pbVar20 + 2;
          if (bVar10 < 0x2b) {
            if (bVar10 < 0x21) goto LAB_0047b21d;
            bVar10 = bVar10 & 0x37;
            goto LAB_0047b08a;
          }
          if (bVar10 < 0x3a) {
            pbVar20 = pbVar15;
            if (bVar10 == 0x2f) break;
            goto LAB_0047b074;
          }
          if (bVar10 < 0x3c) break;
        }
        pbVar20 = pbVar15;
      } while (bVar10 != 0x7d);
LAB_0047b224:
      do {
        pbVar22 = pbVar15 + 1;
        pbVar18 = pbVar15 + 1;
        pbVar15 = pbVar22;
      } while (*pbVar18 != 10);
    }
    goto switchD_0047ad09_caseD_a;
  }
  if (bVar10 < 0x6c) {
    if (0x57 < bVar10) {
      if (bVar10 < 0x66) goto LAB_00480585;
      if (bVar10 == 0x66) goto LAB_0047b9be;
      if (0x67 < bVar10) goto LAB_00480585;
      goto LAB_0047c193;
    }
    if (bVar10 != 0x53) {
      if (bVar10 != 0x57) goto LAB_00480585;
      goto LAB_0047baed;
    }
LAB_0047b739:
    bVar10 = pbVar22[1];
    bVar24 = true;
    if ((bVar10 & 0xdf) != 0x54) {
      pbVar20 = pbVar22 + 1;
      goto LAB_00480596;
    }
    bVar10 = pbVar22[2];
    if ((bVar10 & 0xdf) != 0x4f) {
      pbVar20 = pbVar22 + 2;
      goto LAB_00480596;
    }
    bVar10 = pbVar22[3];
    if ((bVar10 & 0xdf) != 0x50) {
      pbVar20 = pbVar22 + 3;
      goto LAB_00480596;
    }
    pbVar20 = pbVar22 + 4;
    bVar10 = pbVar22[4];
    if (0x39 < bVar10) {
      pbVar17 = pbVar20;
      if (0x3b < bVar10 && bVar10 != 0x7d) goto joined_r0x0047bbf2;
      goto LAB_0048064d;
    }
    if (bVar10 < 0x23 && bVar10 != 0x21) goto LAB_0048064d;
  }
  else {
    if (bVar10 < 0x77) {
      if (bVar10 == 0x6c) {
LAB_0047b7b7:
        bVar10 = pbVar22[1];
        if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047c1f9;
        bVar10 = pbVar22[2];
        if ((bVar10 & 0xdf) != 0x4f) goto LAB_0047c1ff;
        bVar10 = pbVar22[3];
        if ((bVar10 & 0xdf) != 0x50) goto LAB_0047c205;
        pbVar20 = pbVar22 + 4;
        bVar10 = pbVar22[4];
        if (0x39 < bVar10) {
          pbVar17 = pbVar20;
          if (0x3b < bVar10 && bVar10 != 0x7d) goto joined_r0x0047bbf2;
          goto LAB_00480633;
        }
        if (bVar10 < 0x23 && bVar10 != 0x21) goto LAB_00480633;
        bVar24 = true;
        bVar25 = false;
        bVar6 = true;
        goto LAB_0047c1e9;
      }
      if (bVar10 != 0x73) goto LAB_00480585;
      goto LAB_0047b739;
    }
    if (bVar10 != 0x77) {
      if (bVar10 != 0x7d) goto LAB_00480585;
      this->StateMode = '\0';
      this->StateOptions = false;
      this->TokenType = 0x7d;
      pbVar20 = pbVar22 + 1;
      goto LAB_0047b3e0;
    }
LAB_0047baed:
    bVar10 = pbVar22[1];
    if ((bVar10 & 0xdf) != 0x41) goto LAB_0047c1f9;
    bVar10 = pbVar22[2];
    if ((bVar10 & 0xdf) != 0x49) goto LAB_0047c1ff;
    bVar10 = pbVar22[3];
    if ((bVar10 & 0xdf) != 0x54) goto LAB_0047c205;
    pbVar20 = pbVar22 + 4;
    bVar10 = pbVar22[4];
    if (0x39 < bVar10) {
      pbVar17 = pbVar20;
      if (0x3b < bVar10 && bVar10 != 0x7d) goto joined_r0x0047bbf2;
      goto LAB_00480640;
    }
    if (bVar10 < 0x23 && bVar10 != 0x21) goto LAB_00480640;
    bVar24 = false;
  }
  bVar25 = false;
  bVar6 = false;
LAB_0047c1e9:
  pbVar20 = pbVar22 + 4;
  bVar4 = false;
  goto LAB_00480599;
switchD_0047bd6e_caseD_68:
  bVar10 = pbVar22[2];
  if ((bVar10 & 0xdf) != 0x4f) {
LAB_0047e41c:
    pbVar20 = pbVar22 + 2;
    goto switchD_0047bd6e_caseD_6a;
  }
  bVar10 = pbVar22[3];
  if ((bVar10 & 0xdf) != 0x52) {
LAB_0047efcd:
    pbVar20 = pbVar22 + 3;
    goto switchD_0047bd6e_caseD_6a;
  }
  bVar10 = pbVar22[4];
  if ((bVar10 & 0xdf) != 0x54) {
LAB_0047f9b1:
    pbVar20 = pbVar22 + 4;
    goto switchD_0047bd6e_caseD_6a;
  }
  pbVar20 = pbVar22 + 5;
  bVar10 = pbVar22[5];
  if (bVar10 < 0x5b) {
    bVar25 = 0x2f < bVar10;
    bVar24 = (byte)(bVar10 + 0xbf) < 0xf9;
  }
  else {
    if (bVar10 < 0x60) {
      if (bVar10 == 0x5f) goto LAB_0048066e;
      goto LAB_0047fa61;
    }
    bVar25 = bVar10 != 0x60;
    bVar24 = bVar10 < 0x7b;
  }
  if ((bool)(bVar25 & bVar24)) goto LAB_0048066e;
LAB_0047fa61:
  *piVar1 = 0x13a;
  goto LAB_0047b3e0;
switchD_0047bd6e_caseD_6a:
  if (bVar10 < 0x5b) {
    if ((bVar10 < 0x30) || ((byte)(bVar10 - 0x3a) < 7)) goto LAB_00480694;
  }
  else if (bVar10 < 0x60) {
    if (bVar10 != 0x5f) goto LAB_00480694;
  }
  else if ((bVar10 == 0x60) || (0x7a < bVar10)) goto LAB_00480694;
LAB_0048066e:
  bVar10 = pbVar20[1];
  pbVar20 = pbVar20 + 1;
  goto switchD_0047bd6e_caseD_6a;
LAB_00480694:
  *piVar1 = 0x101;
  goto LAB_0047b3e0;
  while( true ) {
    if (0x39 < bVar10) {
      if (bVar10 == 0x45) goto LAB_0047c267;
      goto LAB_0047bbdf;
    }
    if (bVar10 == 0x2e) goto LAB_0047bc1c;
    if (bVar10 < 0x30) break;
LAB_0047b86a:
    pbVar18 = pbVar18 + 1;
    bVar10 = *pbVar18;
    pbVar20 = pbVar18;
    if (0x4c < bVar10) {
      if (bVar10 < 0x66) {
        if (bVar10 != 0x65) goto LAB_0047bbbc;
LAB_0047c267:
        bVar25 = true;
        goto LAB_0047d2b6;
      }
      if (0x6c < bVar10) goto LAB_0047dc25;
      if (bVar10 == 0x6c) goto LAB_0047ecd9;
      break;
    }
  }
LAB_0047ecf7:
  *piVar1 = 0x104;
  goto LAB_0047b3e0;
LAB_0047bbbc:
  pbVar20 = pbVar18;
  if (bVar10 == 0x55) goto LAB_0047ecd9;
  goto LAB_0047ecf7;
LAB_0047ec99:
  bVar10 = *pbVar18;
  pbVar20 = pbVar18;
  if (bVar10 < 0x55) {
    if (bVar10 < 0x41) {
      if (9 < (byte)(bVar10 - 0x30)) goto LAB_0047ecf7;
    }
    else if (0x46 < bVar10) goto LAB_0047bbdf;
  }
  else {
    if (0x6b < bVar10) goto LAB_0047dc19;
    if (bVar10 == 0x55) goto LAB_0047ecd9;
    if (5 < (byte)(bVar10 + 0x9f)) goto LAB_0047ecf7;
  }
  pbVar18 = pbVar18 + 1;
  goto LAB_0047ec99;
LAB_0047dc19:
  if (bVar10 != 0x6c) {
LAB_0047dc25:
    pbVar20 = pbVar18;
    if (bVar10 != 0x75) goto LAB_0047ecf7;
  }
LAB_0047ecd9:
  pbVar20 = pbVar18 + 1;
  bVar10 = pbVar18[1];
  if (bVar10 < 0x56) {
    if ((bVar10 == 0x4c) || (bVar10 == 0x55)) goto LAB_0047ecf0;
  }
  else if (bVar10 < 0x6d) {
    if (bVar10 == 0x6c) {
LAB_0047ecf0:
      pbVar20 = pbVar18 + 2;
    }
  }
  else if (bVar10 == 0x75) goto LAB_0047ecf0;
  goto LAB_0047ecf7;
LAB_0047bbdf:
  pbVar20 = pbVar18;
  if (bVar10 == 0x4c) goto LAB_0047ecd9;
  goto LAB_0047ecf7;
  while( true ) {
    if (bVar10 < 0x30) goto LAB_0047d3ab;
    pbVar18 = pbVar20;
    if (0x39 < bVar10) break;
LAB_0047bc1c:
    pbVar20 = pbVar18 + 1;
    bVar10 = *pbVar20;
    if (0x45 < bVar10) {
      if (bVar10 < 0x65) goto joined_r0x0047ca76;
      if (bVar10 == 0x65) goto LAB_0047d2b4;
      if (0x66 < bVar10) goto LAB_0047d3ab;
      goto LAB_0047d3a8;
    }
  }
  if (bVar10 == 0x45) {
LAB_0047d2b4:
    bVar25 = false;
LAB_0047d2b6:
    bVar10 = pbVar20[1];
    if (bVar10 < 0x2d) {
      if (bVar10 == 0x2b) {
LAB_0047d2c7:
        if (0xf5 < (byte)(pbVar20[2] - 0x3a)) {
          pbVar20 = pbVar20 + 2;
LAB_0047d2e5:
          pbVar20 = pbVar20 + 1;
          bVar10 = *pbVar20;
          if (bVar10 < 0x46) goto code_r0x0047d2f0;
          bVar10 = bVar10 & 0xdf;
joined_r0x0047ca76:
          if (bVar10 == 0x46) {
LAB_0047d3a8:
            pbVar20 = pbVar20 + 1;
          }
          goto LAB_0047d3ab;
        }
      }
    }
    else {
      if (bVar10 == 0x2d) goto LAB_0047d2c7;
      if ((byte)(bVar10 - 0x30) < 10) {
        pbVar20 = pbVar20 + 1;
        goto LAB_0047d2e5;
      }
    }
    if (bVar25) goto LAB_0047ecf7;
  }
LAB_0047d3ab:
  *piVar1 = 0x106;
  goto LAB_0047b3e0;
code_r0x0047d2f0:
  if (9 < (byte)(bVar10 - 0x30)) goto LAB_0047d3ab;
  goto LAB_0047d2e5;
LAB_0047b823:
  do {
    pbVar18 = pbVar17 + 1;
    pbVar17 = pbVar17 + 1;
    bVar10 = *pbVar18;
    while (bVar10 == 0x5c) {
      while (pbVar18 = pbVar17 + 1, *pbVar18 != 0x22) {
        pbVar17 = pbVar17 + 1;
        if (*pbVar18 != 0x5c) goto LAB_0047b823;
      }
      pbVar18 = pbVar17 + 2;
      pbVar17 = pbVar17 + 2;
      bVar10 = *pbVar18;
    }
  } while (bVar10 != 0x22);
  *piVar1 = 0x102;
  pbVar20 = pbVar17 + 1;
  goto LAB_0047b3e0;
LAB_00480599:
  bVar5 = false;
LAB_0048059c:
  pbVar17 = pbVar20;
  if (0x2f < bVar10) {
    if (0x3b < bVar10) {
joined_r0x0047bbf2:
      if (bVar10 != 0x7d) goto LAB_00480585;
      goto LAB_004805d0;
    }
joined_r0x0047bc4b:
    if (0x39 < bVar10) goto LAB_004805d0;
LAB_00480585:
    bVar10 = pbVar17[1];
    pbVar20 = pbVar17 + 1;
LAB_00480596:
    bVar6 = false;
    bVar25 = true;
    bVar24 = true;
    bVar4 = true;
    goto LAB_00480599;
  }
  if (bVar10 < 0x22) {
joined_r0x0047bc02:
    if (bVar10 == 0x21) goto LAB_00480585;
    goto LAB_004805d0;
  }
  if (bVar10 != 0x2f) {
    if (bVar10 != 0x22) goto LAB_00480585;
    goto LAB_004805d0;
  }
  pbVar17 = pbVar20 + 1;
  bVar10 = pbVar20[1];
  if (bVar10 < 0x2f) {
    if (bVar10 < 0x23) {
      if (bVar10 == 0x21) goto LAB_00480585;
    }
    else if (bVar10 != 0x2a) goto LAB_00480585;
  }
  else if (bVar10 < 0x3c) {
    if ((bVar10 != 0x2f) && (bVar10 < 0x3a)) goto LAB_00480585;
  }
  else if (bVar10 != 0x7d) goto LAB_00480585;
  if (bVar25) {
    if (!bVar4) {
      if (bVar5) {
LAB_0048061c:
        *piVar1 = 0x183;
      }
      else {
LAB_0048065a:
        this->StateMode = '\0';
        this->StateOptions = false;
        this->TokenType = 0x14d;
      }
      goto LAB_0047b3e0;
    }
LAB_004805d0:
    *piVar1 = 0x107;
  }
  else if (bVar24) {
    if (bVar6) {
LAB_00480633:
      *piVar1 = 0x182;
    }
    else {
LAB_0048064d:
      *piVar1 = 0x176;
    }
  }
  else {
LAB_00480640:
    *piVar1 = 0x184;
  }
  goto LAB_0047b3e0;
  while (*pbVar18 < 0x21) {
LAB_0047ac18:
    pbVar18 = pbVar22 + 1;
    pbVar22 = pbVar22 + 1;
    if (*pbVar18 == 10) break;
  }
  if (bVar10 < 0x2f) goto LAB_0047aaf0;
LAB_0047aea1:
  iVar11 = this->Line;
  do {
    while( true ) {
      pbVar18 = pbVar22;
      pbVar22 = pbVar18 + 1;
      if (*pbVar18 == 0x2a) break;
      if (*pbVar18 == 10) {
        if (pbVar2 <= pbVar22) goto LAB_0047b3a8;
        iVar11 = iVar11 + 1;
        this->Line = iVar11;
        this->Crossed = true;
      }
    }
  } while (*pbVar22 != 0x2f);
  pbVar22 = pbVar18 + 2;
  if (pbVar2 <= pbVar22) goto LAB_0047b3a8;
  goto LAB_0047aaf0;
  while( true ) {
    bVar10 = pbVar15[2];
    pbVar15 = pbVar15 + 2;
    uVar19 = (uint)bVar10;
    if (0x2e < uVar19) {
      if (0x3c < bVar10) goto joined_r0x0047af8f;
      if (bVar10 == 0x2f) goto LAB_0047b20b;
      goto joined_r0x0047af82;
    }
    pbVar22 = pbVar15;
    if (0x21 < bVar10) {
      bVar10 = bVar10 & 0x37;
      goto joined_r0x0047af71;
    }
    if (bVar10 != 0x21) break;
LAB_0047af51:
    pbVar22 = pbVar15 + 1;
    bVar10 = pbVar15[1];
    if (0x2f < bVar10) {
      pbVar15 = pbVar22;
      if (bVar10 < 0x3d) {
joined_r0x0047af82:
        if (bVar10 == 0x3b) goto LAB_0047b20b;
      }
      else {
        uVar19 = (uint)bVar10;
joined_r0x0047af8f:
        if (uVar19 - 0x7b < 3) goto LAB_0047b20b;
        if (bVar10 == 0x3d) goto LAB_0047b20b;
      }
      goto LAB_0047af51;
    }
    if (bVar10 < 0x21) break;
    if (bVar10 != 0x2f) {
joined_r0x0047af71:
      pbVar15 = pbVar22;
      if (bVar10 == 0x22) goto LAB_0047b20b;
      goto LAB_0047af51;
    }
  }
  while (pbVar15 = pbVar22, bVar10 != 10) {
LAB_0047b20b:
    pbVar22 = pbVar15 + 1;
    bVar10 = pbVar15[1];
  }
switchD_0047ad09_caseD_a:
  pbVar22 = pbVar15 + 1;
LAB_0047b234:
  if (pbVar2 <= pbVar22) goto LAB_0047b3a8;
  this->Line = this->Line + 1;
  this->Crossed = true;
  goto LAB_0047aaf0;
LAB_004806aa:
  pbVar18 = pbVar15;
  pbVar20 = pbVar15;
  if (bVar10 < 0x3b) {
    if (bVar10 < 0x23) {
joined_r0x004806ed:
      pbVar20 = pbVar15;
      if (bVar10 != 0x21) goto LAB_0047b3e0;
    }
    else if (bVar10 == 0x2f) {
      pbVar18 = pbVar15 + 1;
      bVar10 = pbVar15[1];
      if (bVar10 < 0x30) {
        if (bVar10 < 0x23) goto joined_r0x004806ed;
        if ((bVar10 == 0x2a) || (bVar10 == 0x2f)) goto LAB_0047b3e0;
      }
      else if (bVar10 < 0x3d) {
LAB_0048070e:
        pbVar20 = pbVar15;
        if (bVar10 == 0x3b) goto LAB_0047b3e0;
      }
      else {
        if (bVar10 - 0x7b < 3) goto LAB_0047b3e0;
LAB_0048073b:
        pbVar20 = pbVar15;
        if (bVar10 == 0x3d) goto LAB_0047b3e0;
      }
    }
  }
  else if (bVar10 < 0x3e) {
    if (bVar10 != 0x3c) goto LAB_0047b3e0;
  }
  else if ((byte)(bVar10 + 0x85) < 3) goto LAB_0047b3e0;
LAB_004806a1:
  bVar10 = pbVar18[1];
  pbVar15 = pbVar18 + 1;
  goto LAB_004806aa;
LAB_0047b661:
  if (pbVar2 <= pbVar22) goto LAB_0047b898;
  bVar10 = *pbVar22;
  if ((this->Escape == true) && (bVar10 == 0x5c)) {
    if (pbVar22[1] == 0x22) {
      pbVar22 = pbVar22 + 1;
    }
  }
  else if (bVar10 == 10) {
LAB_0047b6a9:
    if (this->CMode == true) {
      if (this->Escape != false) {
        iVar11 = this->StringLen;
        if (((long)iVar11 != 0) && (this->String[(long)iVar11 + -1] == '\\')) {
          this->StringLen = iVar11 + -1;
          goto LAB_0047b6e1;
        }
      }
      ScriptError(this,"Unterminated string constant");
    }
LAB_0047b6e1:
    this->Line = this->Line + 1;
    this->Crossed = true;
  }
  else if (bVar10 == 0xd) {
    if (pbVar22[1] == 10) {
      pbVar22 = pbVar22 + 1;
      goto LAB_0047b6a9;
    }
  }
  else if (bVar10 == 0x22) goto LAB_0047b898;
  iVar11 = this->StringLen;
  if (iVar11 == 0x80) {
    FString::AppendCStrPart(this_00,pcVar14,0x80);
    this->StringLen = 0;
    iVar11 = 0;
  }
  bVar10 = *pbVar22;
  this->StringLen = iVar11 + 1;
  this->StringBuffer[iVar11] = bVar10;
  pbVar22 = pbVar22 + 1;
  goto LAB_0047b661;
LAB_0047b898:
  iVar11 = this->StringLen;
  if (iVar11 == 0x80 || *(int *)((this->BigStringBuffer).Chars + -0xc) != 0) {
    FString::AppendCStrPart(this_00,pcVar14,(long)iVar11);
    pcVar14 = FString::LockBuffer(this_00);
    this->String = pcVar14;
    this->StringLen = *(int *)((this->BigStringBuffer).Chars + -0xc);
  }
  else {
    this->String = pcVar14;
    this->StringBuffer[iVar11] = '\0';
  }
  this->ScriptPtr = (char *)(pbVar22 + 1);
  goto LAB_0047b507;
  while (*pbVar18 < 0x21) {
LAB_0047ade0:
    pbVar18 = pbVar22 + 1;
    pbVar22 = pbVar22 + 1;
    if (*pbVar18 == 10) break;
  }
  if (bVar10 < 0x26) goto LAB_0047aaf0;
  goto LAB_0047aea1;
LAB_0047ab8b:
  lVar13 = lVar13 + 1;
  pbVar21 = pbVar21 + 1;
  pbVar17 = pbVar17 + 1;
  goto LAB_0047ab04;
LAB_0047b57b:
  pbVar17 = pbVar18;
  bVar10 = pbVar17[-1];
  if (0x45 < bVar10) {
    pbVar20 = pbVar17 + -1;
    if (bVar10 < 0x61) {
      if (bVar10 != 0x5f && 0x5a < bVar10) goto LAB_0047b3e0;
      goto LAB_00480749;
    }
    if (0x65 < bVar10) goto joined_r0x0047f35e;
    if (bVar10 != 0x65) goto LAB_00480749;
LAB_0047bac8:
    bVar10 = *pbVar17;
    pbVar21 = pbVar17;
    if (bVar10 < 0x2d) {
      if (bVar10 != 0x2b) goto joined_r0x0047eead;
      goto LAB_0047c21c;
    }
    if (bVar10 == 0x2d) goto LAB_0047c21c;
    pbVar20 = pbVar17;
    if (9 < (byte)(bVar10 - 0x30)) goto LAB_0048074f;
    pbVar18 = pbVar17 + 2;
    goto LAB_0047caab;
  }
  if (0x2e < bVar10) {
    if (0x39 < bVar10) {
      pbVar20 = pbVar17 + -1;
      if (bVar10 < 0x41) goto LAB_0047b3e0;
      if (bVar10 == 0x45) goto LAB_0047bac8;
      goto LAB_00480749;
    }
    pbVar18 = pbVar17 + 1;
    if (bVar10 == 0x2f) goto code_r0x0047b5a6;
    goto LAB_0047b57b;
  }
  pbVar20 = pbVar17 + -1;
  if (bVar10 == 0x27) goto LAB_00480749;
  if (bVar10 != 0x2e) goto LAB_0047b3e0;
LAB_0047b535:
  pbVar18 = pbVar20 + 2;
  do {
    pbVar21 = pbVar18;
    bVar10 = pbVar21[-1];
    if (0x45 < bVar10) {
      pbVar20 = pbVar21 + -1;
      if (bVar10 < 0x65) goto joined_r0x0047b9a1;
      if (bVar10 == 0x65) goto LAB_0047bb67;
      if (bVar10 < 0x67) goto LAB_0047c27c;
      goto LAB_0047b3e0;
    }
    if (bVar10 < 0x30) goto LAB_0047cada;
    pbVar18 = pbVar21 + 1;
  } while (bVar10 < 0x3a);
  if (bVar10 == 0x45) {
LAB_0047bb67:
    bVar10 = *pbVar21;
    pbVar17 = pbVar21 + -1;
    pbVar20 = pbVar17;
    if (bVar10 < 0x2d) {
      if (bVar10 == 0x2b) {
LAB_0047c21c:
        pbVar20 = pbVar17;
        if ((byte)(pbVar21[1] - 0x30) < 10) {
          pbVar21 = pbVar21 + 1;
LAB_0047c22d:
          pbVar21 = pbVar21 + 1;
          bVar10 = *pbVar21;
          pbVar20 = pbVar21;
          if (bVar10 < 0x46) goto code_r0x0047c236;
          bVar10 = bVar10 & 0xdf;
joined_r0x0047b9a1:
          if (bVar10 == 0x46) {
LAB_0047c27c:
            pbVar20 = pbVar20 + 1;
          }
        }
      }
    }
    else {
      if (bVar10 == 0x2d) goto LAB_0047c21c;
      if ((byte)(bVar10 - 0x30) < 10) goto LAB_0047c22d;
    }
  }
  else {
    pbVar20 = pbVar21 + -1;
  }
  goto LAB_0047b3e0;
code_r0x0047c236:
  if (9 < (byte)(bVar10 - 0x30)) goto LAB_0047b3e0;
  goto LAB_0047c22d;
LAB_0047cada:
  pbVar20 = pbVar21 + -1;
  goto LAB_0047b3e0;
code_r0x0047b5a6:
  pbVar20 = pbVar17 + -1;
  goto LAB_0047b3e0;
LAB_0047b3a8:
  pbVar18 = (byte *)this->ScriptEndPtr;
LAB_0047b3ac:
  this->ScriptPtr = (char *)pbVar18;
  lVar13 = 0xe8;
  goto LAB_0047b2ea;
LAB_0047caab:
  pbVar21 = pbVar18;
  bVar10 = pbVar21[-1];
  if (bVar10 < 0x5b) {
    if (0x39 < bVar10) {
      pbVar20 = pbVar21 + -1;
      if (bVar10 < 0x41) goto LAB_0047b3e0;
      if (bVar10 == 0x46) goto LAB_0047ee96;
      goto LAB_00480749;
    }
    if (bVar10 == 0x27) {
      pbVar20 = pbVar21 + -1;
      goto LAB_00480749;
    }
    pbVar18 = pbVar21 + 1;
    if (bVar10 < 0x30) goto LAB_0047cada;
    goto LAB_0047caab;
  }
  pbVar20 = pbVar21 + -1;
  if (bVar10 < 0x66) {
    if (bVar10 != 0x5f && bVar10 < 0x61) goto LAB_0047b3e0;
    goto LAB_00480749;
  }
  if (bVar10 != 0x66) goto joined_r0x0047f35e;
LAB_0047ee96:
  bVar10 = *pbVar21;
  pbVar20 = pbVar21;
  if (bVar10 < 0x5b) {
    pbVar17 = pbVar21;
    if (bVar10 < 0x30) goto joined_r0x0047eead;
    if ((byte)(bVar10 - 0x3a) < 7) goto LAB_0047b3e0;
    goto LAB_00480749;
  }
  if (bVar10 < 0x61) goto joined_r0x0047f3b5;
joined_r0x0047f35e:
  if (3 < (byte)(bVar10 + 0x85)) {
LAB_00480749:
    do {
      bVar10 = pbVar20[1];
      pbVar20 = pbVar20 + 1;
LAB_0048074f:
      if (0x5a < bVar10) {
        if (bVar10 < 0x61) {
joined_r0x0047f3b5:
          if (bVar10 != 0x5f) break;
        }
        else if (0xfb < (byte)(bVar10 + 0x81)) break;
        goto LAB_00480749;
      }
      pbVar17 = pbVar20;
      if (0x2f < bVar10) {
        if (0xf8 < (byte)(bVar10 + 0xbf)) break;
        goto LAB_00480749;
      }
joined_r0x0047eead:
      pbVar20 = pbVar17;
    } while (bVar10 == 0x27);
  }
LAB_0047b3e0:
  if (pbVar2 <= pbVar20) {
    pbVar20 = (byte *)this->ScriptEndPtr;
  }
  this->ScriptPtr = (char *)pbVar20;
  uVar19 = (int)pbVar20 - (int)pbVar22;
  this->StringLen = uVar19;
  if ((tokens) && (uVar23 = *piVar1, (uVar23 & 0xfffffffe) == 0x102)) {
    uVar12 = uVar19 - 2;
    this->StringLen = uVar12;
    if ((int)uVar19 < 0x82) {
      memcpy(this->StringBuffer,pbVar22 + 1,(long)(int)uVar12);
    }
    else {
      FString::FString(&FStack_38,(char *)(pbVar22 + 1),(ulong)uVar12);
      FString::operator=(&this->BigStringBuffer,&FStack_38);
      FString::~FString(&FStack_38);
      uVar23 = *piVar1;
    }
    BVar8 = this->StateMode;
    if ((BVar8 == '\0') || (uVar23 != 0x102)) {
LAB_0047b49a:
      if (BVar8 == '\0') goto LAB_0047b4e0;
      BVar9 = '\x02';
      if (*piVar1 == 0x107) goto LAB_0047b4d6;
    }
    else {
      *piVar1 = 0x107;
LAB_0047b4d6:
      BVar9 = BVar8 + 0xff;
    }
    this->StateMode = BVar9;
  }
  else {
    if ((int)uVar19 < 0x80) {
      memcpy(this->StringBuffer,pbVar22,(long)(int)uVar19);
    }
    else {
      FString::FString(&FStack_38,(char *)pbVar22,(ulong)(uVar19 & 0x7fffffff));
      FString::operator=(&this->BigStringBuffer,&FStack_38);
      FString::~FString(&FStack_38);
    }
    if (tokens) {
      BVar8 = this->StateMode;
      goto LAB_0047b49a;
    }
  }
LAB_0047b4e0:
  if ((long)this->StringLen < 0x80) {
    this->String = this->StringBuffer;
    this->StringBuffer[this->StringLen] = '\0';
  }
  else {
    pcVar14 = FString::LockBuffer(&this->BigStringBuffer);
    this->String = pcVar14;
  }
LAB_0047b507:
  bVar25 = true;
  lVar13 = 0xe8;
LAB_0047b50e:
  this->StringBuffer[lVar13 + -0x58] = tokens;
  return bVar25;
}

Assistant:

bool FScanner::ScanString (bool tokens)
{
	const char *marker, *tok;
	bool return_val;

	CheckOpen();
	if (AlreadyGot)
	{
		AlreadyGot = false;
		if (!tokens || LastGotToken)
		{
			return true;
		}
		ScriptPtr = LastGotPtr;
		Line = LastGotLine;
	}

	Crossed = false;
	if (ScriptPtr >= ScriptEndPtr)
	{
		End = true;
		return false;
	}

	LastGotPtr = ScriptPtr;
	LastGotLine = Line;

	// In case the generated scanner does not use marker, avoid compiler warnings.
	marker;
#include "sc_man_scanner.h"
	LastGotToken = tokens;
	return return_val;
}